

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx512::CurveNiIntersector1<8>::
     occluded_t<embree::avx512::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx512::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [12];
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  Primitive PVar15;
  int iVar16;
  Geometry *pGVar17;
  RTCFilterFunctionN p_Var18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  undefined8 uVar25;
  long lVar26;
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  byte bVar71;
  uint uVar72;
  ulong uVar73;
  long lVar74;
  Geometry *geometry;
  long lVar75;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar86 [16];
  ulong uVar76;
  bool bVar77;
  ulong uVar78;
  byte bVar79;
  float fVar127;
  float fVar129;
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar82 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar85 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar128;
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  float fVar133;
  undefined4 uVar134;
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  float fVar147;
  float fVar149;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined8 uVar141;
  float fVar148;
  undefined1 auVar146 [32];
  float fVar150;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar161;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar164 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [32];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [64];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [64];
  undefined1 auVar185 [64];
  undefined1 auVar186 [64];
  undefined1 auVar187 [64];
  undefined1 auVar188 [64];
  undefined1 auVar189 [64];
  undefined1 auVar190 [64];
  undefined1 auVar191 [64];
  undefined1 auVar192 [64];
  RTCFilterFunctionNArguments args;
  int local_544;
  Ray *local_540;
  Primitive *local_538;
  ulong local_530;
  Precalculations *local_528;
  undefined8 local_520;
  undefined8 uStack_518;
  RTCFilterFunctionNArguments local_510;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined4 local_4c8;
  float local_4c4;
  undefined4 local_4c0;
  undefined4 local_4bc;
  undefined4 local_4b8;
  uint local_4b4;
  uint local_4b0;
  Geometry *local_498;
  RayQueryContext *local_490;
  ulong local_488;
  undefined1 local_480 [16];
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  float local_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_270 [16];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined4 local_200;
  int local_1fc;
  undefined1 local_1f0 [16];
  undefined1 local_1e0 [16];
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined4 uStack_e4;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar15 = prim[1];
  uVar76 = (ulong)(byte)PVar15;
  fVar161 = *(float *)(prim + uVar76 * 0x19 + 0x12);
  local_528 = pre;
  auVar86 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar76 * 0x19 + 6));
  fVar150 = fVar161 * auVar86._0_4_;
  fVar133 = fVar161 * (ray->dir).field_0.m128[0];
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar76 * 4 + 6);
  auVar93 = vpmovsxbd_avx2(auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar76 * 5 + 6);
  auVar90 = vpmovsxbd_avx2(auVar84);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar80._8_8_ = 0;
  auVar80._0_8_ = *(ulong *)(prim + uVar76 * 6 + 6);
  auVar91 = vpmovsxbd_avx2(auVar80);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar76 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar15 * 0xc) + 6);
  auVar97 = vpmovsxbd_avx2(auVar11);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar95 = vcvtdq2ps_avx(auVar97);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + (uint)(byte)PVar15 * 0xc + uVar76 + 6);
  auVar94 = vpmovsxbd_avx2(auVar12);
  auVar94 = vcvtdq2ps_avx(auVar94);
  uVar78 = (ulong)(uint)((int)(uVar76 * 9) * 2);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar78 + 6);
  auVar102 = vpmovsxbd_avx2(auVar13);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar78 + uVar76 + 6);
  auVar101 = vpmovsxbd_avx2(auVar14);
  auVar101 = vcvtdq2ps_avx(auVar101);
  uVar73 = (ulong)(uint)((int)(uVar76 * 5) << 2);
  auVar81._8_8_ = 0;
  auVar81._0_8_ = *(ulong *)(prim + uVar73 + 6);
  auVar89 = vpmovsxbd_avx2(auVar81);
  auVar96 = vcvtdq2ps_avx(auVar89);
  auVar178._4_4_ = fVar133;
  auVar178._0_4_ = fVar133;
  auVar178._8_4_ = fVar133;
  auVar178._12_4_ = fVar133;
  auVar178._16_4_ = fVar133;
  auVar178._20_4_ = fVar133;
  auVar178._24_4_ = fVar133;
  auVar178._28_4_ = fVar133;
  auVar181._8_4_ = 1;
  auVar181._0_8_ = 0x100000001;
  auVar181._12_4_ = 1;
  auVar181._16_4_ = 1;
  auVar181._20_4_ = 1;
  auVar181._24_4_ = 1;
  auVar181._28_4_ = 1;
  auVar87 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar161 * (ray->dir).field_0.m128[3],
                               CONCAT48(fVar161 * (ray->dir).field_0.m128[2],
                                        CONCAT44(fVar161 * (ray->dir).field_0.m128[1],fVar133))));
  auVar98 = vpermps_avx2(auVar181,auVar99);
  auVar88 = vpermps_avx512vl(auVar87,auVar99);
  fVar133 = auVar88._0_4_;
  fVar147 = auVar88._4_4_;
  auVar99._4_4_ = fVar147 * auVar91._4_4_;
  auVar99._0_4_ = fVar133 * auVar91._0_4_;
  fVar148 = auVar88._8_4_;
  auVar99._8_4_ = fVar148 * auVar91._8_4_;
  fVar149 = auVar88._12_4_;
  auVar99._12_4_ = fVar149 * auVar91._12_4_;
  fVar165 = auVar88._16_4_;
  auVar99._16_4_ = fVar165 * auVar91._16_4_;
  fVar166 = auVar88._20_4_;
  auVar99._20_4_ = fVar166 * auVar91._20_4_;
  fVar167 = auVar88._24_4_;
  auVar99._24_4_ = fVar167 * auVar91._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar94._4_4_ * fVar147;
  auVar97._0_4_ = auVar94._0_4_ * fVar133;
  auVar97._8_4_ = auVar94._8_4_ * fVar148;
  auVar97._12_4_ = auVar94._12_4_ * fVar149;
  auVar97._16_4_ = auVar94._16_4_ * fVar165;
  auVar97._20_4_ = auVar94._20_4_ * fVar166;
  auVar97._24_4_ = auVar94._24_4_ * fVar167;
  auVar97._28_4_ = auVar89._28_4_;
  auVar89._4_4_ = auVar96._4_4_ * fVar147;
  auVar89._0_4_ = auVar96._0_4_ * fVar133;
  auVar89._8_4_ = auVar96._8_4_ * fVar148;
  auVar89._12_4_ = auVar96._12_4_ * fVar149;
  auVar89._16_4_ = auVar96._16_4_ * fVar165;
  auVar89._20_4_ = auVar96._20_4_ * fVar166;
  auVar89._24_4_ = auVar96._24_4_ * fVar167;
  auVar89._28_4_ = auVar88._28_4_;
  auVar83 = vfmadd231ps_fma(auVar99,auVar98,auVar90);
  auVar84 = vfmadd231ps_fma(auVar97,auVar98,auVar95);
  auVar80 = vfmadd231ps_fma(auVar89,auVar101,auVar98);
  auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar178,auVar93);
  auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar178,auVar92);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar102,auVar178);
  auVar179._4_4_ = fVar150;
  auVar179._0_4_ = fVar150;
  auVar179._8_4_ = fVar150;
  auVar179._12_4_ = fVar150;
  auVar179._16_4_ = fVar150;
  auVar179._20_4_ = fVar150;
  auVar179._24_4_ = fVar150;
  auVar179._28_4_ = fVar150;
  auVar89 = ZEXT1632(CONCAT412(fVar161 * auVar86._12_4_,
                               CONCAT48(fVar161 * auVar86._8_4_,
                                        CONCAT44(fVar161 * auVar86._4_4_,fVar150))));
  auVar97 = vpermps_avx2(auVar181,auVar89);
  auVar89 = vpermps_avx512vl(auVar87,auVar89);
  fVar161 = auVar89._0_4_;
  fVar133 = auVar89._4_4_;
  auVar98._4_4_ = fVar133 * auVar91._4_4_;
  auVar98._0_4_ = fVar161 * auVar91._0_4_;
  fVar147 = auVar89._8_4_;
  auVar98._8_4_ = fVar147 * auVar91._8_4_;
  fVar148 = auVar89._12_4_;
  auVar98._12_4_ = fVar148 * auVar91._12_4_;
  fVar149 = auVar89._16_4_;
  auVar98._16_4_ = fVar149 * auVar91._16_4_;
  fVar165 = auVar89._20_4_;
  auVar98._20_4_ = fVar165 * auVar91._20_4_;
  fVar166 = auVar89._24_4_;
  auVar98._24_4_ = fVar166 * auVar91._24_4_;
  auVar98._28_4_ = 1;
  auVar87._4_4_ = auVar94._4_4_ * fVar133;
  auVar87._0_4_ = auVar94._0_4_ * fVar161;
  auVar87._8_4_ = auVar94._8_4_ * fVar147;
  auVar87._12_4_ = auVar94._12_4_ * fVar148;
  auVar87._16_4_ = auVar94._16_4_ * fVar149;
  auVar87._20_4_ = auVar94._20_4_ * fVar165;
  auVar87._24_4_ = auVar94._24_4_ * fVar166;
  auVar87._28_4_ = auVar91._28_4_;
  auVar94._4_4_ = auVar96._4_4_ * fVar133;
  auVar94._0_4_ = auVar96._0_4_ * fVar161;
  auVar94._8_4_ = auVar96._8_4_ * fVar147;
  auVar94._12_4_ = auVar96._12_4_ * fVar148;
  auVar94._16_4_ = auVar96._16_4_ * fVar149;
  auVar94._20_4_ = auVar96._20_4_ * fVar165;
  auVar94._24_4_ = auVar96._24_4_ * fVar166;
  auVar94._28_4_ = auVar89._28_4_;
  auVar10 = vfmadd231ps_fma(auVar98,auVar97,auVar90);
  auVar11 = vfmadd231ps_fma(auVar87,auVar97,auVar95);
  auVar12 = vfmadd231ps_fma(auVar94,auVar97,auVar101);
  auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar179,auVar93);
  auVar11 = vfmadd231ps_fma(ZEXT1632(auVar11),auVar179,auVar92);
  auVar170._8_4_ = 0x7fffffff;
  auVar170._0_8_ = 0x7fffffff7fffffff;
  auVar170._12_4_ = 0x7fffffff;
  auVar170._16_4_ = 0x7fffffff;
  auVar170._20_4_ = 0x7fffffff;
  auVar170._24_4_ = 0x7fffffff;
  auVar170._28_4_ = 0x7fffffff;
  auVar12 = vfmadd231ps_fma(ZEXT1632(auVar12),auVar179,auVar102);
  auVar93 = vandps_avx(ZEXT1632(auVar83),auVar170);
  auVar164._8_4_ = 0x219392ef;
  auVar164._0_8_ = 0x219392ef219392ef;
  auVar164._12_4_ = 0x219392ef;
  auVar164._16_4_ = 0x219392ef;
  auVar164._20_4_ = 0x219392ef;
  auVar164._24_4_ = 0x219392ef;
  auVar164._28_4_ = 0x219392ef;
  uVar78 = vcmpps_avx512vl(auVar93,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar88._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar83._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar84),auVar170);
  uVar78 = vcmpps_avx512vl(auVar93,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar100._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar84._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar93 = vandps_avx(ZEXT1632(auVar80),auVar170);
  uVar78 = vcmpps_avx512vl(auVar93,auVar164,1);
  bVar77 = (bool)((byte)uVar78 & 1);
  auVar93._0_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._0_4_;
  bVar77 = (bool)((byte)(uVar78 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._4_4_;
  bVar77 = (bool)((byte)(uVar78 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._8_4_;
  bVar77 = (bool)((byte)(uVar78 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar77 * 0x219392ef | (uint)!bVar77 * auVar80._12_4_;
  auVar93._16_4_ = (uint)((byte)(uVar78 >> 4) & 1) * 0x219392ef;
  auVar93._20_4_ = (uint)((byte)(uVar78 >> 5) & 1) * 0x219392ef;
  auVar93._24_4_ = (uint)((byte)(uVar78 >> 6) & 1) * 0x219392ef;
  auVar93._28_4_ = (uint)(byte)(uVar78 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar92 = vfnmadd213ps_avx512vl(auVar88,auVar90,auVar91);
  auVar83 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar100);
  auVar92 = vfnmadd213ps_avx512vl(auVar100,auVar90,auVar91);
  auVar84 = vfmadd132ps_fma(auVar92,auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar93);
  auVar93 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
  auVar80 = vfmadd132ps_fma(auVar93,auVar90,auVar90);
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 7 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar10));
  auVar102._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar102._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar102._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar102._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar102._16_4_ = auVar93._16_4_ * 0.0;
  auVar102._20_4_ = auVar93._20_4_ * 0.0;
  auVar102._24_4_ = auVar93._24_4_ * 0.0;
  auVar102._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 9 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar10));
  auVar94 = vpbroadcastd_avx512vl();
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar15 * 0x10 + 6));
  auVar146._0_4_ = auVar83._0_4_ * auVar93._0_4_;
  auVar146._4_4_ = auVar83._4_4_ * auVar93._4_4_;
  auVar146._8_4_ = auVar83._8_4_ * auVar93._8_4_;
  auVar146._12_4_ = auVar83._12_4_ * auVar93._12_4_;
  auVar146._16_4_ = auVar93._16_4_ * 0.0;
  auVar146._20_4_ = auVar93._20_4_ * 0.0;
  auVar146._24_4_ = auVar93._24_4_ * 0.0;
  auVar146._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar15 * 0x10 + uVar76 * -2 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar11));
  auVar101._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar101._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar101._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar101._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar101._16_4_ = auVar93._16_4_ * 0.0;
  auVar101._20_4_ = auVar93._20_4_ * 0.0;
  auVar101._24_4_ = auVar93._24_4_ * 0.0;
  auVar101._28_4_ = auVar93._28_4_;
  auVar93 = vcvtdq2ps_avx(auVar90);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar11));
  auVar138._0_4_ = auVar84._0_4_ * auVar93._0_4_;
  auVar138._4_4_ = auVar84._4_4_ * auVar93._4_4_;
  auVar138._8_4_ = auVar84._8_4_ * auVar93._8_4_;
  auVar138._12_4_ = auVar84._12_4_ * auVar93._12_4_;
  auVar138._16_4_ = auVar93._16_4_ * 0.0;
  auVar138._20_4_ = auVar93._20_4_ * 0.0;
  auVar138._24_4_ = auVar93._24_4_ * 0.0;
  auVar138._28_4_ = 0;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 + uVar76 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar12));
  auVar96._4_4_ = auVar93._4_4_ * auVar80._4_4_;
  auVar96._0_4_ = auVar93._0_4_ * auVar80._0_4_;
  auVar96._8_4_ = auVar93._8_4_ * auVar80._8_4_;
  auVar96._12_4_ = auVar93._12_4_ * auVar80._12_4_;
  auVar96._16_4_ = auVar93._16_4_ * 0.0;
  auVar96._20_4_ = auVar93._20_4_ * 0.0;
  auVar96._24_4_ = auVar93._24_4_ * 0.0;
  auVar96._28_4_ = auVar93._28_4_;
  auVar93 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar76 * 0x17 + 6));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar93 = vsubps_avx(auVar93,ZEXT1632(auVar12));
  auVar135._0_4_ = auVar80._0_4_ * auVar93._0_4_;
  auVar135._4_4_ = auVar80._4_4_ * auVar93._4_4_;
  auVar135._8_4_ = auVar80._8_4_ * auVar93._8_4_;
  auVar135._12_4_ = auVar80._12_4_ * auVar93._12_4_;
  auVar135._16_4_ = auVar93._16_4_ * 0.0;
  auVar135._20_4_ = auVar93._20_4_ * 0.0;
  auVar135._24_4_ = auVar93._24_4_ * 0.0;
  auVar135._28_4_ = 0;
  auVar93 = vpminsd_avx2(auVar102,auVar146);
  auVar90 = vpminsd_avx2(auVar101,auVar138);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90 = vpminsd_avx2(auVar96,auVar135);
  uVar134 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar91._4_4_ = uVar134;
  auVar91._0_4_ = uVar134;
  auVar91._8_4_ = uVar134;
  auVar91._12_4_ = uVar134;
  auVar91._16_4_ = uVar134;
  auVar91._20_4_ = uVar134;
  auVar91._24_4_ = uVar134;
  auVar91._28_4_ = uVar134;
  auVar90 = vmaxps_avx512vl(auVar90,auVar91);
  auVar93 = vmaxps_avx(auVar93,auVar90);
  auVar90._8_4_ = 0x3f7ffffa;
  auVar90._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar90._12_4_ = 0x3f7ffffa;
  auVar90._16_4_ = 0x3f7ffffa;
  auVar90._20_4_ = 0x3f7ffffa;
  auVar90._24_4_ = 0x3f7ffffa;
  auVar90._28_4_ = 0x3f7ffffa;
  local_80 = vmulps_avx512vl(auVar93,auVar90);
  auVar93 = vpmaxsd_avx2(auVar102,auVar146);
  auVar90 = vpmaxsd_avx2(auVar101,auVar138);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar90 = vpmaxsd_avx2(auVar96,auVar135);
  fVar161 = ray->tfar;
  auVar92._4_4_ = fVar161;
  auVar92._0_4_ = fVar161;
  auVar92._8_4_ = fVar161;
  auVar92._12_4_ = fVar161;
  auVar92._16_4_ = fVar161;
  auVar92._20_4_ = fVar161;
  auVar92._24_4_ = fVar161;
  auVar92._28_4_ = fVar161;
  auVar90 = vminps_avx512vl(auVar90,auVar92);
  auVar93 = vminps_avx(auVar93,auVar90);
  auVar95._8_4_ = 0x3f800003;
  auVar95._0_8_ = 0x3f8000033f800003;
  auVar95._12_4_ = 0x3f800003;
  auVar95._16_4_ = 0x3f800003;
  auVar95._20_4_ = 0x3f800003;
  auVar95._24_4_ = 0x3f800003;
  auVar95._28_4_ = 0x3f800003;
  auVar93 = vmulps_avx512vl(auVar93,auVar95);
  uVar25 = vpcmpgtd_avx512vl(auVar94,_DAT_01fe9900);
  uVar141 = vcmpps_avx512vl(local_80,auVar93,2);
  if ((byte)((byte)uVar141 & (byte)uVar25) == 0) {
    bVar77 = false;
  }
  else {
    uVar78 = (ulong)(byte)((byte)uVar141 & (byte)uVar25);
    local_540 = ray;
    local_538 = prim;
    do {
      lVar26 = 0;
      for (uVar73 = uVar78; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        lVar26 = lVar26 + 1;
      }
      local_530 = (ulong)*(uint *)(local_538 + 2);
      pGVar17 = (context->scene->geometries).items[*(uint *)(local_538 + 2)].ptr;
      local_488 = (ulong)*(uint *)(local_538 + lVar26 * 4 + 6);
      uVar73 = (ulong)*(uint *)(*(long *)&pGVar17->field_0x58 +
                               pGVar17[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i *
                               (ulong)*(uint *)(local_538 + lVar26 * 4 + 6));
      p_Var18 = pGVar17[1].intersectionFilterN;
      lVar26 = *(long *)&pGVar17[1].time_range.upper;
      local_470 = *(undefined1 (*) [16])(lVar26 + (long)p_Var18 * uVar73);
      local_480 = *(undefined1 (*) [16])(lVar26 + (uVar73 + 1) * (long)p_Var18);
      pauVar3 = (undefined1 (*) [16])(lVar26 + (uVar73 + 2) * (long)p_Var18);
      auVar83 = *pauVar3;
      local_520 = *(undefined8 *)*pauVar3;
      uStack_518 = *(undefined8 *)(*pauVar3 + 8);
      uVar78 = uVar78 - 1 & uVar78;
      pauVar4 = (undefined1 (*) [12])(lVar26 + (uVar73 + 3) * (long)p_Var18);
      local_450 = (float)*(undefined8 *)*pauVar4;
      fStack_44c = (float)((ulong)*(undefined8 *)*pauVar4 >> 0x20);
      fStack_448 = (float)*(undefined8 *)(*pauVar4 + 8);
      fStack_444 = (float)((ulong)*(undefined8 *)(*pauVar4 + 8) >> 0x20);
      if (uVar78 != 0) {
        uVar76 = uVar78 - 1 & uVar78;
        for (uVar73 = uVar78; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
        }
        if (uVar76 != 0) {
          for (; (uVar76 & 1) == 0; uVar76 = uVar76 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar16 = (int)pGVar17[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      aVar5 = (local_540->org).field_0;
      auVar80 = vsubps_avx512vl(local_470,(undefined1  [16])aVar5);
      uVar134 = auVar80._0_4_;
      auVar82._4_4_ = uVar134;
      auVar82._0_4_ = uVar134;
      auVar82._8_4_ = uVar134;
      auVar82._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      aVar6 = (local_528->ray_space).vx.field_0;
      aVar7 = (local_528->ray_space).vy.field_0;
      fVar161 = (local_528->ray_space).vz.field_0.m128[0];
      fVar133 = (local_528->ray_space).vz.field_0.m128[1];
      fVar147 = (local_528->ray_space).vz.field_0.m128[2];
      fVar148 = (local_528->ray_space).vz.field_0.m128[3];
      auVar172._0_4_ = auVar80._0_4_ * fVar161;
      auVar172._4_4_ = auVar80._4_4_ * fVar133;
      auVar172._8_4_ = auVar80._8_4_ * fVar147;
      auVar172._12_4_ = auVar80._12_4_ * fVar148;
      auVar84 = vfmadd231ps_fma(auVar172,(undefined1  [16])aVar7,auVar84);
      auVar11 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar82);
      auVar81 = vshufps_avx512vl(local_470,local_470,0xff);
      auVar80 = vsubps_avx(local_480,(undefined1  [16])aVar5);
      uVar134 = auVar80._0_4_;
      auVar85._4_4_ = uVar134;
      auVar85._0_4_ = uVar134;
      auVar85._8_4_ = uVar134;
      auVar85._12_4_ = uVar134;
      auVar84 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar173._0_4_ = auVar80._0_4_ * fVar161;
      auVar173._4_4_ = auVar80._4_4_ * fVar133;
      auVar173._8_4_ = auVar80._8_4_ * fVar147;
      auVar173._12_4_ = auVar80._12_4_ * fVar148;
      auVar84 = vfmadd231ps_fma(auVar173,(undefined1  [16])aVar7,auVar84);
      auVar12 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar6,auVar85);
      auVar84 = vshufps_avx(local_480,local_480,0xff);
      auVar10 = vsubps_avx(auVar83,(undefined1  [16])aVar5);
      uVar134 = auVar10._0_4_;
      auVar162._4_4_ = uVar134;
      auVar162._0_4_ = uVar134;
      auVar162._8_4_ = uVar134;
      auVar162._12_4_ = uVar134;
      auVar80 = vshufps_avx(auVar10,auVar10,0x55);
      auVar10 = vshufps_avx(auVar10,auVar10,0xaa);
      auVar175._0_4_ = auVar10._0_4_ * fVar161;
      auVar175._4_4_ = auVar10._4_4_ * fVar133;
      auVar175._8_4_ = auVar10._8_4_ * fVar147;
      auVar175._12_4_ = auVar10._12_4_ * fVar148;
      auVar80 = vfmadd231ps_fma(auVar175,(undefined1  [16])aVar7,auVar80);
      auVar10 = vfmadd231ps_fma(auVar80,(undefined1  [16])aVar6,auVar162);
      auVar82 = vshufps_avx512vl(auVar83,auVar83,0xff);
      auVar86._12_4_ = fStack_444;
      auVar86._0_12_ = *pauVar4;
      local_2e0 = ZEXT1632((undefined1  [16])aVar5);
      auVar80 = vsubps_avx(auVar86,(undefined1  [16])aVar5);
      uVar134 = auVar80._0_4_;
      auVar163._4_4_ = uVar134;
      auVar163._0_4_ = uVar134;
      auVar163._8_4_ = uVar134;
      auVar163._12_4_ = uVar134;
      auVar83 = vshufps_avx(auVar80,auVar80,0x55);
      auVar80 = vshufps_avx(auVar80,auVar80,0xaa);
      auVar176._0_4_ = auVar80._0_4_ * fVar161;
      auVar176._4_4_ = auVar80._4_4_ * fVar133;
      auVar176._8_4_ = auVar80._8_4_ * fVar147;
      auVar176._12_4_ = auVar80._12_4_ * fVar148;
      auVar83 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar7,auVar83);
      auVar80 = vfmadd231ps_fma(auVar83,(undefined1  [16])aVar6,auVar163);
      lVar26 = (long)iVar16 * 0x44;
      auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar26);
      uVar134 = auVar11._0_4_;
      local_360._4_4_ = uVar134;
      local_360._0_4_ = uVar134;
      local_360._8_4_ = uVar134;
      local_360._12_4_ = uVar134;
      local_360._16_4_ = uVar134;
      local_360._20_4_ = uVar134;
      local_360._24_4_ = uVar134;
      local_360._28_4_ = uVar134;
      auVar136._8_4_ = 1;
      auVar136._0_8_ = 0x100000001;
      auVar136._12_4_ = 1;
      auVar136._16_4_ = 1;
      auVar136._20_4_ = 1;
      auVar136._24_4_ = 1;
      auVar136._28_4_ = 1;
      local_380 = vpermps_avx2(auVar136,ZEXT1632(auVar11));
      auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x484);
      local_3e0 = vbroadcastss_avx512vl(auVar12);
      local_3a0 = vpermps_avx512vl(auVar136,ZEXT1632(auVar12));
      auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x908);
      local_400 = vbroadcastss_avx512vl(auVar10);
      local_420 = vpermps_avx512vl(auVar136,ZEXT1632(auVar10));
      auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0xd8c);
      uVar134 = auVar80._0_4_;
      local_3c0._4_4_ = uVar134;
      local_3c0._0_4_ = uVar134;
      local_3c0._8_4_ = uVar134;
      local_3c0._12_4_ = uVar134;
      local_3c0._16_4_ = uVar134;
      local_3c0._20_4_ = uVar134;
      local_3c0._24_4_ = uVar134;
      local_3c0._28_4_ = uVar134;
      local_440 = vpermps_avx512vl(auVar136,ZEXT1632(auVar80));
      auVar95 = vmulps_avx512vl(local_3c0,auVar92);
      auVar94 = vmulps_avx512vl(local_440,auVar92);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar91,local_400);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar91,local_420);
      auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_3e0);
      auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_3a0);
      auVar96 = vfmadd231ps_avx512vl(auVar95,auVar93,local_360);
      auVar97 = vfmadd231ps_avx512vl(auVar94,auVar93,local_380);
      auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar26);
      auVar94 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x484);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x908);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0xd8c);
      auVar89 = vmulps_avx512vl(local_3c0,auVar101);
      auVar98 = vmulps_avx512vl(local_440,auVar101);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar102,local_400);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar102,local_420);
      auVar89 = vfmadd231ps_avx512vl(auVar89,auVar94,local_3e0);
      auVar98 = vfmadd231ps_avx512vl(auVar98,auVar94,local_3a0);
      auVar13 = vfmadd231ps_fma(auVar89,auVar95,local_360);
      auVar14 = vfmadd231ps_fma(auVar98,auVar95,local_380);
      auVar89 = vsubps_avx512vl(ZEXT1632(auVar13),auVar96);
      auVar98 = vsubps_avx512vl(ZEXT1632(auVar14),auVar97);
      auVar99 = vmulps_avx512vl(auVar97,auVar89);
      auVar87 = vmulps_avx512vl(auVar96,auVar98);
      auVar99 = vsubps_avx512vl(auVar99,auVar87);
      auVar83 = vshufps_avx512vl(auVar86,auVar86,0xff);
      local_a0 = vbroadcastsd_avx512vl(auVar81);
      uVar141 = auVar84._0_8_;
      local_c0._8_8_ = uVar141;
      local_c0._0_8_ = uVar141;
      local_c0._16_8_ = uVar141;
      local_c0._24_8_ = uVar141;
      local_e0 = vbroadcastsd_avx512vl(auVar82);
      _local_100 = vbroadcastsd_avx512vl(auVar83);
      auVar87 = vmulps_avx512vl(_local_100,auVar92);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar91,local_e0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_c0);
      auVar87 = vfmadd231ps_avx512vl(auVar87,auVar93,local_a0);
      auVar88 = vmulps_avx512vl(_local_100,auVar101);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar102,local_e0);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar94,local_c0);
      auVar81 = vfmadd231ps_fma(auVar88,auVar95,local_a0);
      auVar88 = vmulps_avx512vl(auVar98,auVar98);
      auVar88 = vfmadd231ps_avx512vl(auVar88,auVar89,auVar89);
      auVar100 = vmaxps_avx512vl(auVar87,ZEXT1632(auVar81));
      auVar100 = vmulps_avx512vl(auVar100,auVar100);
      auVar88 = vmulps_avx512vl(auVar100,auVar88);
      auVar99 = vmulps_avx512vl(auVar99,auVar99);
      uVar141 = vcmpps_avx512vl(auVar99,auVar88,2);
      auVar83 = vblendps_avx(auVar11,local_470,8);
      auVar82 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar84 = vandps_avx512vl(auVar83,auVar82);
      auVar83 = vblendps_avx(auVar12,local_480,8);
      auVar83 = vandps_avx512vl(auVar83,auVar82);
      auVar84 = vmaxps_avx(auVar84,auVar83);
      auVar83 = vblendps_avx(auVar10,*pauVar3,8);
      auVar85 = vandps_avx512vl(auVar83,auVar82);
      auVar83 = vblendps_avx(auVar80,auVar86,8);
      auVar83 = vandps_avx512vl(auVar83,auVar82);
      auVar83 = vmaxps_avx(auVar85,auVar83);
      auVar83 = vmaxps_avx(auVar84,auVar83);
      auVar84 = vmovshdup_avx(auVar83);
      auVar84 = vmaxss_avx(auVar84,auVar83);
      auVar83 = vshufpd_avx(auVar83,auVar83,1);
      auVar83 = vmaxss_avx(auVar83,auVar84);
      _local_300 = vcvtsi2ss_avx512f(local_470,iVar16);
      auVar177._0_4_ = local_300._0_4_;
      auVar177._4_4_ = auVar177._0_4_;
      auVar177._8_4_ = auVar177._0_4_;
      auVar177._12_4_ = auVar177._0_4_;
      auVar177._16_4_ = auVar177._0_4_;
      auVar177._20_4_ = auVar177._0_4_;
      auVar177._24_4_ = auVar177._0_4_;
      auVar177._28_4_ = auVar177._0_4_;
      uVar25 = vcmpps_avx512vl(auVar177,_DAT_01faff40,0xe);
      bVar79 = (byte)uVar141 & (byte)uVar25;
      auVar83 = vmulss_avx512f(auVar83,ZEXT416(0x35000000));
      auVar153._8_4_ = 2;
      auVar153._0_8_ = 0x200000002;
      auVar153._12_4_ = 2;
      auVar153._16_4_ = 2;
      auVar153._20_4_ = 2;
      auVar153._24_4_ = 2;
      auVar153._28_4_ = 2;
      local_320 = vpermps_avx2(auVar153,ZEXT1632(auVar11));
      local_340 = vpermps_avx2(auVar153,ZEXT1632(auVar12));
      local_120 = vpermps_avx512vl(auVar153,ZEXT1632(auVar10));
      local_140 = vpermps_avx512vl(auVar153,ZEXT1632(auVar80));
      if (bVar79 == 0) {
        bVar77 = false;
        auVar84 = vxorps_avx512vl(auVar102._0_16_,auVar102._0_16_);
        auVar185 = ZEXT1664(auVar84);
        auVar180 = ZEXT3264(local_360);
        auVar184 = ZEXT3264(local_380);
        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar186 = ZEXT3264(auVar93);
        auVar189 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_3a0);
        auVar187 = ZEXT3264(local_400);
        auVar190 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_3c0);
        auVar192 = ZEXT3264(local_440);
      }
      else {
        auVar101 = vmulps_avx512vl(local_140,auVar101);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_120,auVar101);
        auVar94 = vfmadd213ps_avx512vl(auVar94,local_340,auVar102);
        auVar94 = vfmadd213ps_avx512vl(auVar95,local_320,auVar94);
        auVar92 = vmulps_avx512vl(local_140,auVar92);
        auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
        auVar84 = vfmadd213ps_fma(auVar90,local_340,auVar91);
        auVar90 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1694);
        auVar92 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1b18);
        auVar95 = *(undefined1 (*) [32])(bezier_basis0 + lVar26 + 0x1f9c);
        auVar102 = vfmadd213ps_avx512vl(auVar93,local_320,ZEXT1632(auVar84));
        auVar93 = vmulps_avx512vl(local_3c0,auVar95);
        auVar192 = ZEXT3264(local_440);
        auVar101 = vmulps_avx512vl(local_440,auVar95);
        auVar95 = vmulps_avx512vl(local_140,auVar95);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar92,local_400);
        auVar84 = vfmadd231ps_fma(auVar101,auVar92,local_420);
        auVar92 = vfmadd231ps_avx512vl(auVar95,local_120,auVar92);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar91,local_3e0);
        auVar95 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar91,local_3a0);
        auVar101 = vfmadd231ps_avx512vl(auVar92,local_340,auVar91);
        auVar99 = vfmadd231ps_avx512vl(auVar93,auVar90,local_360);
        auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,local_380);
        auVar93 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1210);
        auVar91 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1b18);
        auVar92 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1f9c);
        auVar84 = vfmadd231ps_fma(auVar101,local_320,auVar90);
        auVar90 = vmulps_avx512vl(local_3c0,auVar92);
        auVar101 = vmulps_avx512vl(local_440,auVar92);
        auVar92 = vmulps_avx512vl(local_140,auVar92);
        auVar88 = vfmadd231ps_avx512vl(auVar90,auVar91,local_400);
        auVar80 = vfmadd231ps_fma(auVar101,auVar91,local_420);
        auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
        auVar90 = *(undefined1 (*) [32])(bezier_basis1 + lVar26 + 0x1694);
        auVar92 = vfmadd231ps_avx512vl(auVar88,auVar90,local_3e0);
        auVar101 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar90,local_3a0);
        auVar90 = vfmadd231ps_avx512vl(auVar91,local_340,auVar90);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar93,local_360);
        auVar92 = vfmadd231ps_avx512vl(auVar101,auVar93,local_380);
        auVar80 = vfmadd231ps_fma(auVar90,local_320,auVar93);
        auVar182._8_4_ = 0x7fffffff;
        auVar182._0_8_ = 0x7fffffff7fffffff;
        auVar182._12_4_ = 0x7fffffff;
        auVar182._16_4_ = 0x7fffffff;
        auVar182._20_4_ = 0x7fffffff;
        auVar182._24_4_ = 0x7fffffff;
        auVar182._28_4_ = 0x7fffffff;
        auVar93 = vandps_avx(auVar99,auVar182);
        auVar90 = vandps_avx(auVar95,auVar182);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(ZEXT1632(auVar84),auVar182);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        auVar101 = vbroadcastss_avx512vl(auVar83);
        uVar73 = vcmpps_avx512vl(auVar93,auVar101,1);
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar103._0_4_ = (float)((uint)bVar77 * auVar89._0_4_ | (uint)!bVar77 * auVar99._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar103._4_4_ = (float)((uint)bVar77 * auVar89._4_4_ | (uint)!bVar77 * auVar99._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar103._8_4_ = (float)((uint)bVar77 * auVar89._8_4_ | (uint)!bVar77 * auVar99._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar103._12_4_ = (float)((uint)bVar77 * auVar89._12_4_ | (uint)!bVar77 * auVar99._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar103._16_4_ = (float)((uint)bVar77 * auVar89._16_4_ | (uint)!bVar77 * auVar99._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar103._20_4_ = (float)((uint)bVar77 * auVar89._20_4_ | (uint)!bVar77 * auVar99._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar103._24_4_ = (float)((uint)bVar77 * auVar89._24_4_ | (uint)!bVar77 * auVar99._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar103._28_4_ = (uint)bVar77 * auVar89._28_4_ | (uint)!bVar77 * auVar99._28_4_;
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar104._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar95._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar104._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar95._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar104._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar95._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar104._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar95._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar104._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar95._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar104._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar95._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar104._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar95._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar104._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar95._28_4_;
        auVar93 = vandps_avx(auVar182,auVar91);
        auVar90 = vandps_avx(auVar92,auVar182);
        auVar90 = vmaxps_avx(auVar93,auVar90);
        auVar93 = vandps_avx(ZEXT1632(auVar80),auVar182);
        auVar93 = vmaxps_avx(auVar90,auVar93);
        uVar73 = vcmpps_avx512vl(auVar93,auVar101,1);
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar105._0_4_ = (float)((uint)bVar77 * auVar89._0_4_ | (uint)!bVar77 * auVar91._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar105._4_4_ = (float)((uint)bVar77 * auVar89._4_4_ | (uint)!bVar77 * auVar91._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar105._8_4_ = (float)((uint)bVar77 * auVar89._8_4_ | (uint)!bVar77 * auVar91._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar105._12_4_ = (float)((uint)bVar77 * auVar89._12_4_ | (uint)!bVar77 * auVar91._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar105._16_4_ = (float)((uint)bVar77 * auVar89._16_4_ | (uint)!bVar77 * auVar91._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar105._20_4_ = (float)((uint)bVar77 * auVar89._20_4_ | (uint)!bVar77 * auVar91._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar105._24_4_ = (float)((uint)bVar77 * auVar89._24_4_ | (uint)!bVar77 * auVar91._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar105._28_4_ = (uint)bVar77 * auVar89._28_4_ | (uint)!bVar77 * auVar91._28_4_;
        bVar77 = (bool)((byte)uVar73 & 1);
        auVar106._0_4_ = (float)((uint)bVar77 * auVar98._0_4_ | (uint)!bVar77 * auVar92._0_4_);
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar106._4_4_ = (float)((uint)bVar77 * auVar98._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar106._8_4_ = (float)((uint)bVar77 * auVar98._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar106._12_4_ = (float)((uint)bVar77 * auVar98._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar106._16_4_ = (float)((uint)bVar77 * auVar98._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar106._20_4_ = (float)((uint)bVar77 * auVar98._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar106._24_4_ = (float)((uint)bVar77 * auVar98._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar106._28_4_ = (uint)bVar77 * auVar98._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar86 = vxorps_avx512vl(auVar83,auVar83);
        auVar185 = ZEXT1664(auVar86);
        auVar93 = vfmadd213ps_avx512vl(auVar103,auVar103,ZEXT1632(auVar86));
        auVar84 = vfmadd231ps_fma(auVar93,auVar104,auVar104);
        auVar93 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar161 = auVar93._0_4_;
        fVar133 = auVar93._4_4_;
        fVar147 = auVar93._8_4_;
        fVar148 = auVar93._12_4_;
        fVar149 = auVar93._16_4_;
        fVar165 = auVar93._20_4_;
        fVar166 = auVar93._24_4_;
        auVar34._4_4_ = fVar133 * fVar133 * fVar133 * auVar84._4_4_ * -0.5;
        auVar34._0_4_ = fVar161 * fVar161 * fVar161 * auVar84._0_4_ * -0.5;
        auVar34._8_4_ = fVar147 * fVar147 * fVar147 * auVar84._8_4_ * -0.5;
        auVar34._12_4_ = fVar148 * fVar148 * fVar148 * auVar84._12_4_ * -0.5;
        auVar34._16_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar34._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar34._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar34._28_4_ = 0;
        auVar90 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar91 = vfmadd231ps_avx512vl(auVar34,auVar90,auVar93);
        auVar35._4_4_ = auVar104._4_4_ * auVar91._4_4_;
        auVar35._0_4_ = auVar104._0_4_ * auVar91._0_4_;
        auVar35._8_4_ = auVar104._8_4_ * auVar91._8_4_;
        auVar35._12_4_ = auVar104._12_4_ * auVar91._12_4_;
        auVar35._16_4_ = auVar104._16_4_ * auVar91._16_4_;
        auVar35._20_4_ = auVar104._20_4_ * auVar91._20_4_;
        auVar35._24_4_ = auVar104._24_4_ * auVar91._24_4_;
        auVar35._28_4_ = auVar93._28_4_;
        auVar36._4_4_ = auVar91._4_4_ * -auVar103._4_4_;
        auVar36._0_4_ = auVar91._0_4_ * -auVar103._0_4_;
        auVar36._8_4_ = auVar91._8_4_ * -auVar103._8_4_;
        auVar36._12_4_ = auVar91._12_4_ * -auVar103._12_4_;
        auVar36._16_4_ = auVar91._16_4_ * -auVar103._16_4_;
        auVar36._20_4_ = auVar91._20_4_ * -auVar103._20_4_;
        auVar36._24_4_ = auVar91._24_4_ * -auVar103._24_4_;
        auVar36._28_4_ = auVar103._28_4_ ^ 0x80000000;
        auVar93 = vmulps_avx512vl(auVar91,ZEXT1632(auVar86));
        auVar98 = ZEXT1632(auVar86);
        auVar92 = vfmadd213ps_avx512vl(auVar105,auVar105,auVar98);
        auVar84 = vfmadd231ps_fma(auVar92,auVar106,auVar106);
        auVar92 = vrsqrt14ps_avx512vl(ZEXT1632(auVar84));
        fVar161 = auVar92._0_4_;
        fVar133 = auVar92._4_4_;
        fVar147 = auVar92._8_4_;
        fVar148 = auVar92._12_4_;
        fVar149 = auVar92._16_4_;
        fVar165 = auVar92._20_4_;
        fVar166 = auVar92._24_4_;
        auVar37._4_4_ = fVar133 * fVar133 * fVar133 * auVar84._4_4_ * -0.5;
        auVar37._0_4_ = fVar161 * fVar161 * fVar161 * auVar84._0_4_ * -0.5;
        auVar37._8_4_ = fVar147 * fVar147 * fVar147 * auVar84._8_4_ * -0.5;
        auVar37._12_4_ = fVar148 * fVar148 * fVar148 * auVar84._12_4_ * -0.5;
        auVar37._16_4_ = fVar149 * fVar149 * fVar149 * -0.0;
        auVar37._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
        auVar37._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
        auVar37._28_4_ = 0;
        auVar90 = vfmadd231ps_avx512vl(auVar37,auVar90,auVar92);
        auVar38._4_4_ = auVar106._4_4_ * auVar90._4_4_;
        auVar38._0_4_ = auVar106._0_4_ * auVar90._0_4_;
        auVar38._8_4_ = auVar106._8_4_ * auVar90._8_4_;
        auVar38._12_4_ = auVar106._12_4_ * auVar90._12_4_;
        auVar38._16_4_ = auVar106._16_4_ * auVar90._16_4_;
        auVar38._20_4_ = auVar106._20_4_ * auVar90._20_4_;
        auVar38._24_4_ = auVar106._24_4_ * auVar90._24_4_;
        auVar38._28_4_ = auVar92._28_4_;
        auVar39._4_4_ = -auVar105._4_4_ * auVar90._4_4_;
        auVar39._0_4_ = -auVar105._0_4_ * auVar90._0_4_;
        auVar39._8_4_ = -auVar105._8_4_ * auVar90._8_4_;
        auVar39._12_4_ = -auVar105._12_4_ * auVar90._12_4_;
        auVar39._16_4_ = -auVar105._16_4_ * auVar90._16_4_;
        auVar39._20_4_ = -auVar105._20_4_ * auVar90._20_4_;
        auVar39._24_4_ = -auVar105._24_4_ * auVar90._24_4_;
        auVar39._28_4_ = auVar91._28_4_;
        auVar90 = vmulps_avx512vl(auVar90,auVar98);
        auVar91 = vfmadd213ps_avx512vl(auVar35,auVar87,auVar96);
        auVar92 = vfmadd213ps_avx512vl(auVar36,auVar87,auVar97);
        auVar95 = vfmadd213ps_avx512vl(auVar93,auVar87,auVar102);
        auVar101 = vfmadd213ps_avx512vl(auVar38,ZEXT1632(auVar81),ZEXT1632(auVar13));
        auVar96 = vfnmadd213ps_avx512vl(auVar35,auVar87,auVar96);
        auVar89 = ZEXT1632(auVar81);
        auVar84 = vfmadd213ps_fma(auVar39,auVar89,ZEXT1632(auVar14));
        auVar97 = vfnmadd213ps_avx512vl(auVar36,auVar87,auVar97);
        auVar80 = vfmadd213ps_fma(auVar90,auVar89,auVar94);
        auVar102 = vfnmadd231ps_avx512vl(auVar102,auVar87,auVar93);
        auVar12 = vfnmadd213ps_fma(auVar38,auVar89,ZEXT1632(auVar13));
        auVar13 = vfnmadd213ps_fma(auVar39,auVar89,ZEXT1632(auVar14));
        auVar14 = vfnmadd231ps_fma(auVar94,ZEXT1632(auVar81),auVar90);
        auVar90 = vsubps_avx512vl(auVar101,auVar96);
        auVar93 = vsubps_avx(ZEXT1632(auVar84),auVar97);
        auVar94 = vsubps_avx512vl(ZEXT1632(auVar80),auVar102);
        auVar89 = vmulps_avx512vl(auVar93,auVar102);
        auVar10 = vfmsub231ps_fma(auVar89,auVar97,auVar94);
        auVar40._4_4_ = auVar96._4_4_ * auVar94._4_4_;
        auVar40._0_4_ = auVar96._0_4_ * auVar94._0_4_;
        auVar40._8_4_ = auVar96._8_4_ * auVar94._8_4_;
        auVar40._12_4_ = auVar96._12_4_ * auVar94._12_4_;
        auVar40._16_4_ = auVar96._16_4_ * auVar94._16_4_;
        auVar40._20_4_ = auVar96._20_4_ * auVar94._20_4_;
        auVar40._24_4_ = auVar96._24_4_ * auVar94._24_4_;
        auVar40._28_4_ = auVar94._28_4_;
        auVar94 = vfmsub231ps_avx512vl(auVar40,auVar102,auVar90);
        auVar41._4_4_ = auVar97._4_4_ * auVar90._4_4_;
        auVar41._0_4_ = auVar97._0_4_ * auVar90._0_4_;
        auVar41._8_4_ = auVar97._8_4_ * auVar90._8_4_;
        auVar41._12_4_ = auVar97._12_4_ * auVar90._12_4_;
        auVar41._16_4_ = auVar97._16_4_ * auVar90._16_4_;
        auVar41._20_4_ = auVar97._20_4_ * auVar90._20_4_;
        auVar41._24_4_ = auVar97._24_4_ * auVar90._24_4_;
        auVar41._28_4_ = auVar90._28_4_;
        auVar11 = vfmsub231ps_fma(auVar41,auVar96,auVar93);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar11),auVar98,auVar94);
        auVar93 = vfmadd231ps_avx512vl(auVar93,auVar98,ZEXT1632(auVar10));
        auVar89 = ZEXT1632(auVar86);
        uVar73 = vcmpps_avx512vl(auVar93,auVar89,2);
        bVar71 = (byte)uVar73;
        auVar107._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar91._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar12._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar107._4_4_ = (float)((uint)bVar77 * auVar91._4_4_ | (uint)!bVar77 * auVar12._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar107._8_4_ = (float)((uint)bVar77 * auVar91._8_4_ | (uint)!bVar77 * auVar12._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar107._12_4_ = (float)((uint)bVar77 * auVar91._12_4_ | (uint)!bVar77 * auVar12._12_4_);
        fVar133 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar91._16_4_);
        auVar107._16_4_ = fVar133;
        fVar161 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar91._20_4_);
        auVar107._20_4_ = fVar161;
        fVar147 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar91._24_4_);
        auVar107._24_4_ = fVar147;
        auVar107._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar91._28_4_;
        auVar108._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar92._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar13._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar77 * auVar92._4_4_ | (uint)!bVar77 * auVar13._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar77 * auVar92._8_4_ | (uint)!bVar77 * auVar13._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar77 * auVar92._12_4_ | (uint)!bVar77 * auVar13._12_4_);
        fVar148 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar92._16_4_);
        auVar108._16_4_ = fVar148;
        fVar149 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar92._20_4_);
        auVar108._20_4_ = fVar149;
        fVar165 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar92._24_4_);
        auVar108._24_4_ = fVar165;
        auVar108._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar92._28_4_;
        auVar109._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar95._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar14._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar77 * auVar95._4_4_ | (uint)!bVar77 * auVar14._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar77 * auVar95._8_4_ | (uint)!bVar77 * auVar14._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar77 * auVar95._12_4_ | (uint)!bVar77 * auVar14._12_4_);
        fVar166 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar95._16_4_);
        auVar109._16_4_ = fVar166;
        fVar167 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar95._20_4_);
        auVar109._20_4_ = fVar167;
        fVar150 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar95._24_4_);
        auVar109._24_4_ = fVar150;
        iVar1 = (uint)(byte)(uVar73 >> 7) * auVar95._28_4_;
        auVar109._28_4_ = iVar1;
        auVar90 = vblendmps_avx512vl(auVar96,auVar101);
        auVar110._0_4_ =
             (uint)(bVar71 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar10._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar110._4_4_ = (uint)bVar77 * auVar90._4_4_ | (uint)!bVar77 * auVar10._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar110._8_4_ = (uint)bVar77 * auVar90._8_4_ | (uint)!bVar77 * auVar10._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar110._12_4_ = (uint)bVar77 * auVar90._12_4_ | (uint)!bVar77 * auVar10._12_4_;
        auVar110._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar90._16_4_;
        auVar110._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar90._20_4_;
        auVar110._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar90._24_4_;
        auVar110._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar90._28_4_;
        auVar90 = vblendmps_avx512vl(auVar97,ZEXT1632(auVar84));
        auVar111._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar92._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar111._4_4_ = (float)((uint)bVar77 * auVar90._4_4_ | (uint)!bVar77 * auVar92._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar111._8_4_ = (float)((uint)bVar77 * auVar90._8_4_ | (uint)!bVar77 * auVar92._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar111._12_4_ = (float)((uint)bVar77 * auVar90._12_4_ | (uint)!bVar77 * auVar92._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar111._16_4_ = (float)((uint)bVar77 * auVar90._16_4_ | (uint)!bVar77 * auVar92._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar111._20_4_ = (float)((uint)bVar77 * auVar90._20_4_ | (uint)!bVar77 * auVar92._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar111._24_4_ = (float)((uint)bVar77 * auVar90._24_4_ | (uint)!bVar77 * auVar92._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar111._28_4_ = (uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar92._28_4_;
        auVar90 = vblendmps_avx512vl(auVar102,ZEXT1632(auVar80));
        auVar112._0_4_ =
             (float)((uint)(bVar71 & 1) * auVar90._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar95._0_4_)
        ;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar112._4_4_ = (float)((uint)bVar77 * auVar90._4_4_ | (uint)!bVar77 * auVar95._4_4_);
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar112._8_4_ = (float)((uint)bVar77 * auVar90._8_4_ | (uint)!bVar77 * auVar95._8_4_);
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar112._12_4_ = (float)((uint)bVar77 * auVar90._12_4_ | (uint)!bVar77 * auVar95._12_4_);
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar112._16_4_ = (float)((uint)bVar77 * auVar90._16_4_ | (uint)!bVar77 * auVar95._16_4_);
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar112._20_4_ = (float)((uint)bVar77 * auVar90._20_4_ | (uint)!bVar77 * auVar95._20_4_);
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar112._24_4_ = (float)((uint)bVar77 * auVar90._24_4_ | (uint)!bVar77 * auVar95._24_4_);
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar112._28_4_ = (uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar95._28_4_;
        auVar113._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar96._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar101._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar113._4_4_ = (uint)bVar77 * (int)auVar96._4_4_ | (uint)!bVar77 * auVar101._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar113._8_4_ = (uint)bVar77 * (int)auVar96._8_4_ | (uint)!bVar77 * auVar101._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar113._12_4_ = (uint)bVar77 * (int)auVar96._12_4_ | (uint)!bVar77 * auVar101._12_4_;
        bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar113._16_4_ = (uint)bVar77 * (int)auVar96._16_4_ | (uint)!bVar77 * auVar101._16_4_;
        bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar113._20_4_ = (uint)bVar77 * (int)auVar96._20_4_ | (uint)!bVar77 * auVar101._20_4_;
        bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar113._24_4_ = (uint)bVar77 * (int)auVar96._24_4_ | (uint)!bVar77 * auVar101._24_4_;
        bVar77 = SUB81(uVar73 >> 7,0);
        auVar113._28_4_ = (uint)bVar77 * auVar96._28_4_ | (uint)!bVar77 * auVar101._28_4_;
        auVar114._0_4_ =
             (uint)(bVar71 & 1) * (int)auVar97._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar84._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar114._4_4_ = (uint)bVar77 * (int)auVar97._4_4_ | (uint)!bVar77 * auVar84._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar114._8_4_ = (uint)bVar77 * (int)auVar97._8_4_ | (uint)!bVar77 * auVar84._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar114._12_4_ = (uint)bVar77 * (int)auVar97._12_4_ | (uint)!bVar77 * auVar84._12_4_;
        auVar114._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * (int)auVar97._16_4_;
        auVar114._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * (int)auVar97._20_4_;
        auVar114._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * (int)auVar97._24_4_;
        auVar114._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar97._28_4_;
        auVar115._0_4_ =
             (uint)(bVar71 & 1) * auVar102._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar80._0_4_;
        bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar115._4_4_ = (uint)bVar77 * auVar102._4_4_ | (uint)!bVar77 * auVar80._4_4_;
        bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar115._8_4_ = (uint)bVar77 * auVar102._8_4_ | (uint)!bVar77 * auVar80._8_4_;
        bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar115._12_4_ = (uint)bVar77 * auVar102._12_4_ | (uint)!bVar77 * auVar80._12_4_;
        auVar115._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar102._16_4_;
        auVar115._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar102._20_4_;
        auVar115._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar102._24_4_;
        iVar2 = (uint)(byte)(uVar73 >> 7) * auVar102._28_4_;
        auVar115._28_4_ = iVar2;
        auVar102 = vsubps_avx512vl(auVar113,auVar107);
        auVar90 = vsubps_avx(auVar114,auVar108);
        auVar91 = vsubps_avx(auVar115,auVar109);
        auVar92 = vsubps_avx(auVar107,auVar110);
        auVar95 = vsubps_avx(auVar108,auVar111);
        auVar94 = vsubps_avx(auVar109,auVar112);
        auVar42._4_4_ = auVar91._4_4_ * auVar107._4_4_;
        auVar42._0_4_ = auVar91._0_4_ * auVar107._0_4_;
        auVar42._8_4_ = auVar91._8_4_ * auVar107._8_4_;
        auVar42._12_4_ = auVar91._12_4_ * auVar107._12_4_;
        auVar42._16_4_ = auVar91._16_4_ * fVar133;
        auVar42._20_4_ = auVar91._20_4_ * fVar161;
        auVar42._24_4_ = auVar91._24_4_ * fVar147;
        auVar42._28_4_ = iVar2;
        auVar84 = vfmsub231ps_fma(auVar42,auVar109,auVar102);
        auVar43._4_4_ = auVar108._4_4_ * auVar102._4_4_;
        auVar43._0_4_ = auVar108._0_4_ * auVar102._0_4_;
        auVar43._8_4_ = auVar108._8_4_ * auVar102._8_4_;
        auVar43._12_4_ = auVar108._12_4_ * auVar102._12_4_;
        auVar43._16_4_ = fVar148 * auVar102._16_4_;
        auVar43._20_4_ = fVar149 * auVar102._20_4_;
        auVar43._24_4_ = fVar165 * auVar102._24_4_;
        auVar43._28_4_ = auVar93._28_4_;
        auVar80 = vfmsub231ps_fma(auVar43,auVar107,auVar90);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar89,ZEXT1632(auVar84));
        auVar155._0_4_ = auVar90._0_4_ * auVar109._0_4_;
        auVar155._4_4_ = auVar90._4_4_ * auVar109._4_4_;
        auVar155._8_4_ = auVar90._8_4_ * auVar109._8_4_;
        auVar155._12_4_ = auVar90._12_4_ * auVar109._12_4_;
        auVar155._16_4_ = auVar90._16_4_ * fVar166;
        auVar155._20_4_ = auVar90._20_4_ * fVar167;
        auVar155._24_4_ = auVar90._24_4_ * fVar150;
        auVar155._28_4_ = 0;
        auVar84 = vfmsub231ps_fma(auVar155,auVar108,auVar91);
        auVar101 = vfmadd231ps_avx512vl(auVar93,auVar89,ZEXT1632(auVar84));
        auVar93 = vmulps_avx512vl(auVar94,auVar110);
        auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar112);
        auVar44._4_4_ = auVar95._4_4_ * auVar112._4_4_;
        auVar44._0_4_ = auVar95._0_4_ * auVar112._0_4_;
        auVar44._8_4_ = auVar95._8_4_ * auVar112._8_4_;
        auVar44._12_4_ = auVar95._12_4_ * auVar112._12_4_;
        auVar44._16_4_ = auVar95._16_4_ * auVar112._16_4_;
        auVar44._20_4_ = auVar95._20_4_ * auVar112._20_4_;
        auVar44._24_4_ = auVar95._24_4_ * auVar112._24_4_;
        auVar44._28_4_ = auVar112._28_4_;
        auVar84 = vfmsub231ps_fma(auVar44,auVar111,auVar94);
        auVar156._0_4_ = auVar111._0_4_ * auVar92._0_4_;
        auVar156._4_4_ = auVar111._4_4_ * auVar92._4_4_;
        auVar156._8_4_ = auVar111._8_4_ * auVar92._8_4_;
        auVar156._12_4_ = auVar111._12_4_ * auVar92._12_4_;
        auVar156._16_4_ = auVar111._16_4_ * auVar92._16_4_;
        auVar156._20_4_ = auVar111._20_4_ * auVar92._20_4_;
        auVar156._24_4_ = auVar111._24_4_ * auVar92._24_4_;
        auVar156._28_4_ = 0;
        auVar80 = vfmsub231ps_fma(auVar156,auVar95,auVar110);
        auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar80),auVar89,auVar93);
        auVar96 = vfmadd231ps_avx512vl(auVar93,auVar89,ZEXT1632(auVar84));
        auVar93 = vmaxps_avx(auVar101,auVar96);
        uVar141 = vcmpps_avx512vl(auVar93,auVar89,2);
        bVar79 = bVar79 & (byte)uVar141;
        auVar180 = ZEXT3264(local_360);
        auVar184 = ZEXT3264(local_380);
        auVar189 = ZEXT3264(local_3e0);
        auVar191 = ZEXT3264(local_3a0);
        auVar187 = ZEXT3264(local_400);
        auVar190 = ZEXT3264(local_420);
        auVar188 = ZEXT3264(local_3c0);
        if (bVar79 == 0) {
          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar186 = ZEXT3264(auVar93);
        }
        else {
          auVar45._4_4_ = auVar94._4_4_ * auVar90._4_4_;
          auVar45._0_4_ = auVar94._0_4_ * auVar90._0_4_;
          auVar45._8_4_ = auVar94._8_4_ * auVar90._8_4_;
          auVar45._12_4_ = auVar94._12_4_ * auVar90._12_4_;
          auVar45._16_4_ = auVar94._16_4_ * auVar90._16_4_;
          auVar45._20_4_ = auVar94._20_4_ * auVar90._20_4_;
          auVar45._24_4_ = auVar94._24_4_ * auVar90._24_4_;
          auVar45._28_4_ = auVar93._28_4_;
          auVar10 = vfmsub231ps_fma(auVar45,auVar95,auVar91);
          auVar46._4_4_ = auVar91._4_4_ * auVar92._4_4_;
          auVar46._0_4_ = auVar91._0_4_ * auVar92._0_4_;
          auVar46._8_4_ = auVar91._8_4_ * auVar92._8_4_;
          auVar46._12_4_ = auVar91._12_4_ * auVar92._12_4_;
          auVar46._16_4_ = auVar91._16_4_ * auVar92._16_4_;
          auVar46._20_4_ = auVar91._20_4_ * auVar92._20_4_;
          auVar46._24_4_ = auVar91._24_4_ * auVar92._24_4_;
          auVar46._28_4_ = auVar91._28_4_;
          auVar80 = vfmsub231ps_fma(auVar46,auVar102,auVar94);
          auVar47._4_4_ = auVar95._4_4_ * auVar102._4_4_;
          auVar47._0_4_ = auVar95._0_4_ * auVar102._0_4_;
          auVar47._8_4_ = auVar95._8_4_ * auVar102._8_4_;
          auVar47._12_4_ = auVar95._12_4_ * auVar102._12_4_;
          auVar47._16_4_ = auVar95._16_4_ * auVar102._16_4_;
          auVar47._20_4_ = auVar95._20_4_ * auVar102._20_4_;
          auVar47._24_4_ = auVar95._24_4_ * auVar102._24_4_;
          auVar47._28_4_ = auVar95._28_4_;
          auVar11 = vfmsub231ps_fma(auVar47,auVar92,auVar90);
          auVar84 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar80),ZEXT1632(auVar11));
          auVar90 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),ZEXT1632(auVar10),auVar89);
          auVar93 = vrcp14ps_avx512vl(auVar90);
          auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
          auVar186 = ZEXT3264(auVar91);
          auVar92 = vfnmadd213ps_avx512vl(auVar93,auVar90,auVar91);
          auVar84 = vfmadd132ps_fma(auVar92,auVar93,auVar93);
          auVar48._4_4_ = auVar11._4_4_ * auVar109._4_4_;
          auVar48._0_4_ = auVar11._0_4_ * auVar109._0_4_;
          auVar48._8_4_ = auVar11._8_4_ * auVar109._8_4_;
          auVar48._12_4_ = auVar11._12_4_ * auVar109._12_4_;
          auVar48._16_4_ = fVar166 * 0.0;
          auVar48._20_4_ = fVar167 * 0.0;
          auVar48._24_4_ = fVar150 * 0.0;
          auVar48._28_4_ = iVar1;
          auVar80 = vfmadd231ps_fma(auVar48,auVar108,ZEXT1632(auVar80));
          auVar80 = vfmadd231ps_fma(ZEXT1632(auVar80),auVar107,ZEXT1632(auVar10));
          fVar133 = auVar84._0_4_;
          fVar147 = auVar84._4_4_;
          fVar148 = auVar84._8_4_;
          fVar149 = auVar84._12_4_;
          local_220 = ZEXT1632(CONCAT412(auVar80._12_4_ * fVar149,
                                         CONCAT48(auVar80._8_4_ * fVar148,
                                                  CONCAT44(auVar80._4_4_ * fVar147,
                                                           auVar80._0_4_ * fVar133))));
          auVar171._8_4_ = 3;
          auVar171._0_8_ = 0x300000003;
          auVar171._12_4_ = 3;
          auVar171._16_4_ = 3;
          auVar171._20_4_ = 3;
          auVar171._24_4_ = 3;
          auVar171._28_4_ = 3;
          auVar93 = vpermps_avx2(auVar171,ZEXT1632((undefined1  [16])aVar5));
          uVar141 = vcmpps_avx512vl(auVar93,local_220,2);
          fVar161 = local_540->tfar;
          auVar27._4_4_ = fVar161;
          auVar27._0_4_ = fVar161;
          auVar27._8_4_ = fVar161;
          auVar27._12_4_ = fVar161;
          auVar27._16_4_ = fVar161;
          auVar27._20_4_ = fVar161;
          auVar27._24_4_ = fVar161;
          auVar27._28_4_ = fVar161;
          uVar25 = vcmpps_avx512vl(local_220,auVar27,2);
          bVar79 = (byte)uVar141 & (byte)uVar25 & bVar79;
          if (bVar79 != 0) {
            uVar141 = vcmpps_avx512vl(auVar90,auVar89,4);
            bVar79 = bVar79 & (byte)uVar141;
            if (bVar79 != 0) {
              fVar161 = auVar101._0_4_ * fVar133;
              fVar165 = auVar101._4_4_ * fVar147;
              auVar49._4_4_ = fVar165;
              auVar49._0_4_ = fVar161;
              fVar166 = auVar101._8_4_ * fVar148;
              auVar49._8_4_ = fVar166;
              fVar167 = auVar101._12_4_ * fVar149;
              auVar49._12_4_ = fVar167;
              fVar150 = auVar101._16_4_ * 0.0;
              auVar49._16_4_ = fVar150;
              fVar168 = auVar101._20_4_ * 0.0;
              auVar49._20_4_ = fVar168;
              fVar169 = auVar101._24_4_ * 0.0;
              auVar49._24_4_ = fVar169;
              auVar49._28_4_ = auVar90._28_4_;
              auVar93 = vsubps_avx512vl(auVar91,auVar49);
              local_260._0_4_ =
                   (float)((uint)(bVar71 & 1) * (int)fVar161 |
                          (uint)!(bool)(bVar71 & 1) * auVar93._0_4_);
              bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
              local_260._4_4_ = (float)((uint)bVar77 * (int)fVar165 | (uint)!bVar77 * auVar93._4_4_)
              ;
              bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
              local_260._8_4_ = (float)((uint)bVar77 * (int)fVar166 | (uint)!bVar77 * auVar93._8_4_)
              ;
              bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
              local_260._12_4_ =
                   (float)((uint)bVar77 * (int)fVar167 | (uint)!bVar77 * auVar93._12_4_);
              bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
              local_260._16_4_ =
                   (float)((uint)bVar77 * (int)fVar150 | (uint)!bVar77 * auVar93._16_4_);
              bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
              local_260._20_4_ =
                   (float)((uint)bVar77 * (int)fVar168 | (uint)!bVar77 * auVar93._20_4_);
              bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
              local_260._24_4_ =
                   (float)((uint)bVar77 * (int)fVar169 | (uint)!bVar77 * auVar93._24_4_);
              bVar77 = SUB81(uVar73 >> 7,0);
              local_260._28_4_ =
                   (float)((uint)bVar77 * auVar90._28_4_ | (uint)!bVar77 * auVar93._28_4_);
              auVar93 = vsubps_avx512vl(ZEXT1632(auVar81),auVar87);
              auVar93 = vfmadd213ps_avx512vl(auVar93,local_260,auVar87);
              auVar139._0_4_ = auVar93._0_4_ + auVar93._0_4_;
              auVar139._4_4_ = auVar93._4_4_ + auVar93._4_4_;
              auVar139._8_4_ = auVar93._8_4_ + auVar93._8_4_;
              auVar139._12_4_ = auVar93._12_4_ + auVar93._12_4_;
              auVar139._16_4_ = auVar93._16_4_ + auVar93._16_4_;
              auVar139._20_4_ = auVar93._20_4_ + auVar93._20_4_;
              auVar139._24_4_ = auVar93._24_4_ + auVar93._24_4_;
              fVar165 = auVar93._28_4_;
              auVar139._28_4_ = fVar165 + fVar165;
              fVar161 = local_528->depth_scale;
              auVar28._4_4_ = fVar161;
              auVar28._0_4_ = fVar161;
              auVar28._8_4_ = fVar161;
              auVar28._12_4_ = fVar161;
              auVar28._16_4_ = fVar161;
              auVar28._20_4_ = fVar161;
              auVar28._24_4_ = fVar161;
              auVar28._28_4_ = fVar161;
              auVar93 = vmulps_avx512vl(auVar139,auVar28);
              uVar141 = vcmpps_avx512vl(local_220,auVar93,6);
              if (((byte)uVar141 & bVar79) != 0) {
                auVar8._0_4_ = local_540->tfar;
                auVar8._4_4_ = local_540->mask;
                auVar8._8_4_ = local_540->id;
                auVar8._12_4_ = local_540->flags;
                uVar72 = vextractps_avx(auVar8,1);
                fVar133 = auVar96._0_4_ * fVar133;
                fVar147 = auVar96._4_4_ * fVar147;
                auVar50._4_4_ = fVar147;
                auVar50._0_4_ = fVar133;
                fVar148 = auVar96._8_4_ * fVar148;
                auVar50._8_4_ = fVar148;
                fVar149 = auVar96._12_4_ * fVar149;
                auVar50._12_4_ = fVar149;
                fVar161 = auVar96._16_4_ * 0.0;
                auVar50._16_4_ = fVar161;
                fVar166 = auVar96._20_4_ * 0.0;
                auVar50._20_4_ = fVar166;
                fVar167 = auVar96._24_4_ * 0.0;
                auVar50._24_4_ = fVar167;
                auVar50._28_4_ = fVar165;
                auVar93 = vsubps_avx512vl(auVar91,auVar50);
                auVar116._0_4_ =
                     (uint)(bVar71 & 1) * (int)fVar133 | (uint)!(bool)(bVar71 & 1) * auVar93._0_4_;
                bVar77 = (bool)((byte)(uVar73 >> 1) & 1);
                auVar116._4_4_ = (uint)bVar77 * (int)fVar147 | (uint)!bVar77 * auVar93._4_4_;
                bVar77 = (bool)((byte)(uVar73 >> 2) & 1);
                auVar116._8_4_ = (uint)bVar77 * (int)fVar148 | (uint)!bVar77 * auVar93._8_4_;
                bVar77 = (bool)((byte)(uVar73 >> 3) & 1);
                auVar116._12_4_ = (uint)bVar77 * (int)fVar149 | (uint)!bVar77 * auVar93._12_4_;
                bVar77 = (bool)((byte)(uVar73 >> 4) & 1);
                auVar116._16_4_ = (uint)bVar77 * (int)fVar161 | (uint)!bVar77 * auVar93._16_4_;
                bVar77 = (bool)((byte)(uVar73 >> 5) & 1);
                auVar116._20_4_ = (uint)bVar77 * (int)fVar166 | (uint)!bVar77 * auVar93._20_4_;
                bVar77 = (bool)((byte)(uVar73 >> 6) & 1);
                auVar116._24_4_ = (uint)bVar77 * (int)fVar167 | (uint)!bVar77 * auVar93._24_4_;
                bVar77 = SUB81(uVar73 >> 7,0);
                auVar116._28_4_ = (uint)bVar77 * (int)fVar165 | (uint)!bVar77 * auVar93._28_4_;
                auVar29._8_4_ = 0x40000000;
                auVar29._0_8_ = 0x4000000040000000;
                auVar29._12_4_ = 0x40000000;
                auVar29._16_4_ = 0x40000000;
                auVar29._20_4_ = 0x40000000;
                auVar29._24_4_ = 0x40000000;
                auVar29._28_4_ = 0x40000000;
                local_240 = vfmsub132ps_avx512vl(auVar116,auVar91,auVar29);
                local_200 = 0;
                local_1fc = iVar16;
                local_1f0 = local_470;
                local_1e0 = local_480;
                local_1d0 = *(undefined8 *)*pauVar3;
                uStack_1c8 = *(undefined8 *)(*pauVar3 + 8);
                if ((pGVar17->mask & uVar72) != 0) {
                  if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                     (bVar77 = true, pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    fVar161 = 1.0 / auVar177._0_4_;
                    local_1a0[0] = fVar161 * (local_260._0_4_ + 0.0);
                    local_1a0[1] = fVar161 * (local_260._4_4_ + 1.0);
                    local_1a0[2] = fVar161 * (local_260._8_4_ + 2.0);
                    local_1a0[3] = fVar161 * (local_260._12_4_ + 3.0);
                    fStack_190 = fVar161 * (local_260._16_4_ + 4.0);
                    fStack_18c = fVar161 * (local_260._20_4_ + 5.0);
                    fStack_188 = fVar161 * (local_260._24_4_ + 6.0);
                    fStack_184 = local_260._28_4_ + 7.0;
                    local_180 = local_240;
                    local_160 = local_220;
                    lVar75 = 0;
                    uVar76 = (ulong)((byte)uVar141 & bVar79);
                    for (uVar73 = uVar76; (uVar73 & 1) == 0;
                        uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                      lVar75 = lVar75 + 1;
                    }
                    local_4e0 = auVar83;
                    local_460 = auVar8;
                    do {
                      auVar80 = auVar185._0_16_;
                      local_2c0._0_8_ = uVar76;
                      local_4c4 = local_1a0[lVar75];
                      local_4c0 = *(undefined4 *)(local_180 + lVar75 * 4);
                      local_2a0._0_8_ = lVar75;
                      local_540->tfar = *(float *)(local_160 + lVar75 * 4);
                      local_510.context = context->user;
                      fVar133 = 1.0 - local_4c4;
                      fVar161 = fVar133 * fVar133 * -3.0;
                      auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                ZEXT416((uint)(local_4c4 * fVar133)),
                                                ZEXT416(0xc0000000));
                      auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar133)),
                                                ZEXT416((uint)(local_4c4 * local_4c4)),
                                                ZEXT416(0x40000000));
                      fVar133 = auVar83._0_4_ * 3.0;
                      fVar147 = auVar84._0_4_ * 3.0;
                      fVar148 = local_4c4 * local_4c4 * 3.0;
                      auVar159._0_4_ = fVar148 * local_450;
                      auVar159._4_4_ = fVar148 * fStack_44c;
                      auVar159._8_4_ = fVar148 * fStack_448;
                      auVar159._12_4_ = fVar148 * fStack_444;
                      auVar142._4_4_ = fVar147;
                      auVar142._0_4_ = fVar147;
                      auVar142._8_4_ = fVar147;
                      auVar142._12_4_ = fVar147;
                      auVar69._8_8_ = uStack_518;
                      auVar69._0_8_ = local_520;
                      auVar83 = vfmadd132ps_fma(auVar142,auVar159,auVar69);
                      auVar151._4_4_ = fVar133;
                      auVar151._0_4_ = fVar133;
                      auVar151._8_4_ = fVar133;
                      auVar151._12_4_ = fVar133;
                      auVar83 = vfmadd213ps_fma(auVar151,local_480,auVar83);
                      auVar143._4_4_ = fVar161;
                      auVar143._0_4_ = fVar161;
                      auVar143._8_4_ = fVar161;
                      auVar143._12_4_ = fVar161;
                      auVar83 = vfmadd213ps_fma(auVar143,local_470,auVar83);
                      local_4d0 = vmovlps_avx(auVar83);
                      local_4c8 = vextractps_avx(auVar83,2);
                      local_4bc = (int)local_488;
                      local_4b8 = (int)local_530;
                      local_4b4 = (local_510.context)->instID[0];
                      local_4b0 = (local_510.context)->instPrimID[0];
                      local_544 = -1;
                      local_510.valid = &local_544;
                      local_510.geometryUserPtr = pGVar17->userPtr;
                      local_510.ray = (RTCRayN *)local_540;
                      local_510.hit = (RTCHitN *)&local_4d0;
                      local_510.N = 1;
                      if ((pGVar17->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                         ((*pGVar17->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                        p_Var18 = context->args->filter;
                        if ((p_Var18 == (RTCFilterFunctionN)0x0) ||
                           ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((pGVar17->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*p_Var18)(&local_510), *local_510.valid != 0)))) {
                          bVar77 = true;
                          auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                          auVar186 = ZEXT3264(auVar93);
                          auVar83 = vxorps_avx512vl(auVar80,auVar80);
                          auVar185 = ZEXT1664(auVar83);
                          auVar180 = ZEXT3264(local_360);
                          auVar184 = ZEXT3264(local_380);
                          auVar189 = ZEXT3264(local_3e0);
                          auVar191 = ZEXT3264(local_3a0);
                          auVar187 = ZEXT3264(local_400);
                          auVar190 = ZEXT3264(local_420);
                          auVar188 = ZEXT3264(local_3c0);
                          auVar192 = ZEXT3264(local_440);
                          auVar83 = local_4e0;
                          break;
                        }
                      }
                      local_540->tfar = (float)local_460._0_4_;
                      bVar77 = false;
                      lVar75 = 0;
                      uVar76 = local_2c0._0_8_ ^ 1L << (local_2a0._0_8_ & 0x3f);
                      for (uVar73 = uVar76; (uVar73 & 1) == 0;
                          uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        lVar75 = lVar75 + 1;
                      }
                      auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar186 = ZEXT3264(auVar93);
                      auVar83 = vxorps_avx512vl(auVar80,auVar80);
                      auVar185 = ZEXT1664(auVar83);
                      auVar180 = ZEXT3264(local_360);
                      auVar184 = ZEXT3264(local_380);
                      auVar189 = ZEXT3264(local_3e0);
                      auVar191 = ZEXT3264(local_3a0);
                      auVar187 = ZEXT3264(local_400);
                      auVar190 = ZEXT3264(local_420);
                      auVar188 = ZEXT3264(local_3c0);
                      auVar192 = ZEXT3264(local_440);
                      auVar83 = local_4e0;
                    } while (uVar76 != 0);
                  }
                  goto LAB_01d589bb;
                }
              }
            }
            bVar77 = false;
            goto LAB_01d589bb;
          }
        }
        bVar77 = false;
      }
LAB_01d589bb:
      if (8 < iVar16) {
        local_2a0 = vpbroadcastd_avx512vl();
        local_2c0 = vbroadcastss_avx512vl(auVar83);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        local_2e0 = vpermps_avx2(auVar137,local_2e0);
        local_300._4_4_ = 1.0 / (float)local_300._0_4_;
        local_300._0_4_ = local_300._4_4_;
        fStack_2f8 = (float)local_300._4_4_;
        fStack_2f4 = (float)local_300._4_4_;
        fStack_2f0 = (float)local_300._4_4_;
        fStack_2ec = (float)local_300._4_4_;
        fStack_2e8 = (float)local_300._4_4_;
        fStack_2e4 = (float)local_300._4_4_;
        lVar75 = 8;
        do {
          auVar93 = vpbroadcastd_avx512vl();
          auVar95 = vpor_avx2(auVar93,_DAT_01fe9900);
          uVar25 = vpcmpd_avx512vl(auVar95,local_2a0,1);
          auVar93 = *(undefined1 (*) [32])(bezier_basis0 + lVar75 * 4 + lVar26);
          auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21aa768 + lVar75 * 4);
          auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21aabec + lVar75 * 4);
          auVar92 = *(undefined1 (*) [32])(lVar26 + 0x21ab070 + lVar75 * 4);
          local_3c0 = auVar188._0_32_;
          auVar94 = vmulps_avx512vl(local_3c0,auVar92);
          auVar146 = auVar192._0_32_;
          auVar102 = vmulps_avx512vl(auVar146,auVar92);
          auVar51._4_4_ = auVar92._4_4_ * (float)local_100._4_4_;
          auVar51._0_4_ = auVar92._0_4_ * (float)local_100._0_4_;
          auVar51._8_4_ = auVar92._8_4_ * fStack_f8;
          auVar51._12_4_ = auVar92._12_4_ * fStack_f4;
          auVar51._16_4_ = auVar92._16_4_ * fStack_f0;
          auVar51._20_4_ = auVar92._20_4_ * fStack_ec;
          auVar51._24_4_ = auVar92._24_4_ * fStack_e8;
          auVar51._28_4_ = auVar95._28_4_;
          auVar100 = auVar187._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar94,auVar91,auVar100);
          auVar138 = auVar190._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar138);
          auVar102 = vfmadd231ps_avx512vl(auVar51,auVar91,local_e0);
          auVar135 = auVar189._0_32_;
          auVar95 = vfmadd231ps_avx512vl(auVar95,auVar90,auVar135);
          local_3a0 = auVar191._0_32_;
          auVar94 = vfmadd231ps_avx512vl(auVar94,auVar90,local_3a0);
          auVar83 = vfmadd231ps_fma(auVar102,auVar90,local_c0);
          local_360 = auVar180._0_32_;
          auVar84 = vfmadd231ps_fma(auVar95,auVar93,local_360);
          local_380 = auVar184._0_32_;
          auVar80 = vfmadd231ps_fma(auVar94,auVar93,local_380);
          auVar95 = *(undefined1 (*) [32])(bezier_basis1 + lVar75 * 4 + lVar26);
          auVar94 = *(undefined1 (*) [32])(lVar26 + 0x21acb88 + lVar75 * 4);
          auVar83 = vfmadd231ps_fma(ZEXT1632(auVar83),auVar93,local_a0);
          auVar102 = *(undefined1 (*) [32])(lVar26 + 0x21ad00c + lVar75 * 4);
          auVar101 = *(undefined1 (*) [32])(lVar26 + 0x21ad490 + lVar75 * 4);
          auVar96 = vmulps_avx512vl(local_3c0,auVar101);
          auVar97 = vmulps_avx512vl(auVar146,auVar101);
          auVar52._4_4_ = auVar101._4_4_ * (float)local_100._4_4_;
          auVar52._0_4_ = auVar101._0_4_ * (float)local_100._0_4_;
          auVar52._8_4_ = auVar101._8_4_ * fStack_f8;
          auVar52._12_4_ = auVar101._12_4_ * fStack_f4;
          auVar52._16_4_ = auVar101._16_4_ * fStack_f0;
          auVar52._20_4_ = auVar101._20_4_ * fStack_ec;
          auVar52._24_4_ = auVar101._24_4_ * fStack_e8;
          auVar52._28_4_ = uStack_e4;
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar102,auVar100);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar102,auVar138);
          auVar89 = vfmadd231ps_avx512vl(auVar52,auVar102,local_e0);
          auVar96 = vfmadd231ps_avx512vl(auVar96,auVar94,auVar135);
          auVar97 = vfmadd231ps_avx512vl(auVar97,auVar94,local_3a0);
          auVar10 = vfmadd231ps_fma(auVar89,auVar94,local_c0);
          auVar89 = vfmadd231ps_avx512vl(auVar96,auVar95,local_360);
          auVar98 = vfmadd231ps_avx512vl(auVar97,auVar95,local_380);
          auVar10 = vfmadd231ps_fma(ZEXT1632(auVar10),auVar95,local_a0);
          auVar99 = vmaxps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar10));
          auVar96 = vsubps_avx(auVar89,ZEXT1632(auVar84));
          auVar97 = vsubps_avx(auVar98,ZEXT1632(auVar80));
          auVar87 = vmulps_avx512vl(ZEXT1632(auVar80),auVar96);
          auVar88 = vmulps_avx512vl(ZEXT1632(auVar84),auVar97);
          auVar87 = vsubps_avx512vl(auVar87,auVar88);
          auVar88 = vmulps_avx512vl(auVar97,auVar97);
          auVar88 = vfmadd231ps_avx512vl(auVar88,auVar96,auVar96);
          auVar99 = vmulps_avx512vl(auVar99,auVar99);
          auVar99 = vmulps_avx512vl(auVar99,auVar88);
          auVar87 = vmulps_avx512vl(auVar87,auVar87);
          uVar141 = vcmpps_avx512vl(auVar87,auVar99,2);
          bVar79 = (byte)uVar25 & (byte)uVar141;
          if (bVar79 == 0) {
            auVar180 = ZEXT3264(local_360);
            auVar184 = ZEXT3264(local_380);
          }
          else {
            auVar101 = vmulps_avx512vl(local_140,auVar101);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_120,auVar101);
            auVar94 = vfmadd213ps_avx512vl(auVar94,local_340,auVar102);
            auVar95 = vfmadd213ps_avx512vl(auVar95,local_320,auVar94);
            auVar92 = vmulps_avx512vl(local_140,auVar92);
            auVar91 = vfmadd213ps_avx512vl(auVar91,local_120,auVar92);
            auVar90 = vfmadd213ps_avx512vl(auVar90,local_340,auVar91);
            auVar94 = vfmadd213ps_avx512vl(auVar93,local_320,auVar90);
            auVar93 = *(undefined1 (*) [32])(lVar26 + 0x21ab4f4 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21ab978 + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21abdfc + lVar75 * 4);
            auVar92 = *(undefined1 (*) [32])(lVar26 + 0x21ac280 + lVar75 * 4);
            auVar102 = vmulps_avx512vl(local_3c0,auVar92);
            auVar101 = vmulps_avx512vl(auVar146,auVar92);
            auVar92 = vmulps_avx512vl(local_140,auVar92);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar91,auVar100);
            auVar101 = vfmadd231ps_avx512vl(auVar101,auVar91,auVar138);
            auVar91 = vfmadd231ps_avx512vl(auVar92,local_120,auVar91);
            auVar92 = vfmadd231ps_avx512vl(auVar102,auVar90,auVar135);
            auVar102 = vfmadd231ps_avx512vl(auVar101,auVar90,local_3a0);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_340,auVar90);
            auVar92 = vfmadd231ps_avx512vl(auVar92,auVar93,local_360);
            auVar102 = vfmadd231ps_avx512vl(auVar102,auVar93,local_380);
            auVar101 = vfmadd231ps_avx512vl(auVar90,local_320,auVar93);
            auVar93 = *(undefined1 (*) [32])(lVar26 + 0x21ad914 + lVar75 * 4);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21ae21c + lVar75 * 4);
            auVar91 = *(undefined1 (*) [32])(lVar26 + 0x21ae6a0 + lVar75 * 4);
            auVar99 = vmulps_avx512vl(local_3c0,auVar91);
            auVar87 = vmulps_avx512vl(auVar146,auVar91);
            auVar91 = vmulps_avx512vl(local_140,auVar91);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar100);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,auVar138);
            auVar91 = vfmadd231ps_avx512vl(auVar91,local_120,auVar90);
            auVar90 = *(undefined1 (*) [32])(lVar26 + 0x21add98 + lVar75 * 4);
            auVar99 = vfmadd231ps_avx512vl(auVar99,auVar90,auVar135);
            auVar87 = vfmadd231ps_avx512vl(auVar87,auVar90,local_3a0);
            auVar90 = vfmadd231ps_avx512vl(auVar91,local_340,auVar90);
            auVar91 = vfmadd231ps_avx512vl(auVar99,auVar93,local_360);
            auVar99 = vfmadd231ps_avx512vl(auVar87,auVar93,local_380);
            auVar90 = vfmadd231ps_avx512vl(auVar90,local_320,auVar93);
            auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar92,auVar87);
            vandps_avx512vl(auVar102,auVar87);
            auVar93 = vmaxps_avx(auVar87,auVar87);
            vandps_avx512vl(auVar101,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar87);
            uVar73 = vcmpps_avx512vl(auVar93,local_2c0,1);
            bVar19 = (bool)((byte)uVar73 & 1);
            auVar117._0_4_ = (float)((uint)bVar19 * auVar96._0_4_ | (uint)!bVar19 * auVar92._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar117._4_4_ = (float)((uint)bVar19 * auVar96._4_4_ | (uint)!bVar19 * auVar92._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar117._8_4_ = (float)((uint)bVar19 * auVar96._8_4_ | (uint)!bVar19 * auVar92._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar117._12_4_ =
                 (float)((uint)bVar19 * auVar96._12_4_ | (uint)!bVar19 * auVar92._12_4_);
            bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar117._16_4_ =
                 (float)((uint)bVar19 * auVar96._16_4_ | (uint)!bVar19 * auVar92._16_4_);
            bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar117._20_4_ =
                 (float)((uint)bVar19 * auVar96._20_4_ | (uint)!bVar19 * auVar92._20_4_);
            bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar117._24_4_ =
                 (float)((uint)bVar19 * auVar96._24_4_ | (uint)!bVar19 * auVar92._24_4_);
            bVar19 = SUB81(uVar73 >> 7,0);
            auVar117._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar92._28_4_;
            bVar19 = (bool)((byte)uVar73 & 1);
            auVar118._0_4_ = (float)((uint)bVar19 * auVar97._0_4_ | (uint)!bVar19 * auVar102._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar118._4_4_ = (float)((uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * auVar102._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar118._8_4_ = (float)((uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * auVar102._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar118._12_4_ =
                 (float)((uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * auVar102._12_4_);
            bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar118._16_4_ =
                 (float)((uint)bVar19 * auVar97._16_4_ | (uint)!bVar19 * auVar102._16_4_);
            bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar118._20_4_ =
                 (float)((uint)bVar19 * auVar97._20_4_ | (uint)!bVar19 * auVar102._20_4_);
            bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar118._24_4_ =
                 (float)((uint)bVar19 * auVar97._24_4_ | (uint)!bVar19 * auVar102._24_4_);
            bVar19 = SUB81(uVar73 >> 7,0);
            auVar118._28_4_ = (uint)bVar19 * auVar97._28_4_ | (uint)!bVar19 * auVar102._28_4_;
            vandps_avx512vl(auVar91,auVar87);
            vandps_avx512vl(auVar99,auVar87);
            auVar93 = vmaxps_avx(auVar118,auVar118);
            vandps_avx512vl(auVar90,auVar87);
            auVar93 = vmaxps_avx(auVar93,auVar118);
            uVar73 = vcmpps_avx512vl(auVar93,local_2c0,1);
            bVar19 = (bool)((byte)uVar73 & 1);
            auVar119._0_4_ = (uint)bVar19 * auVar96._0_4_ | (uint)!bVar19 * auVar91._0_4_;
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar119._4_4_ = (uint)bVar19 * auVar96._4_4_ | (uint)!bVar19 * auVar91._4_4_;
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar119._8_4_ = (uint)bVar19 * auVar96._8_4_ | (uint)!bVar19 * auVar91._8_4_;
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar119._12_4_ = (uint)bVar19 * auVar96._12_4_ | (uint)!bVar19 * auVar91._12_4_;
            bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar119._16_4_ = (uint)bVar19 * auVar96._16_4_ | (uint)!bVar19 * auVar91._16_4_;
            bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar119._20_4_ = (uint)bVar19 * auVar96._20_4_ | (uint)!bVar19 * auVar91._20_4_;
            bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar119._24_4_ = (uint)bVar19 * auVar96._24_4_ | (uint)!bVar19 * auVar91._24_4_;
            bVar19 = SUB81(uVar73 >> 7,0);
            auVar119._28_4_ = (uint)bVar19 * auVar96._28_4_ | (uint)!bVar19 * auVar91._28_4_;
            bVar19 = (bool)((byte)uVar73 & 1);
            auVar120._0_4_ = (float)((uint)bVar19 * auVar97._0_4_ | (uint)!bVar19 * auVar99._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar120._4_4_ = (float)((uint)bVar19 * auVar97._4_4_ | (uint)!bVar19 * auVar99._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar120._8_4_ = (float)((uint)bVar19 * auVar97._8_4_ | (uint)!bVar19 * auVar99._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar120._12_4_ =
                 (float)((uint)bVar19 * auVar97._12_4_ | (uint)!bVar19 * auVar99._12_4_);
            bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar120._16_4_ =
                 (float)((uint)bVar19 * auVar97._16_4_ | (uint)!bVar19 * auVar99._16_4_);
            bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar120._20_4_ =
                 (float)((uint)bVar19 * auVar97._20_4_ | (uint)!bVar19 * auVar99._20_4_);
            bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar120._24_4_ =
                 (float)((uint)bVar19 * auVar97._24_4_ | (uint)!bVar19 * auVar99._24_4_);
            bVar19 = SUB81(uVar73 >> 7,0);
            auVar120._28_4_ = (uint)bVar19 * auVar97._28_4_ | (uint)!bVar19 * auVar99._28_4_;
            auVar174._8_4_ = 0x80000000;
            auVar174._0_8_ = 0x8000000080000000;
            auVar174._12_4_ = 0x80000000;
            auVar174._16_4_ = 0x80000000;
            auVar174._20_4_ = 0x80000000;
            auVar174._24_4_ = 0x80000000;
            auVar174._28_4_ = 0x80000000;
            auVar93 = vxorps_avx512vl(auVar119,auVar174);
            auVar88 = auVar185._0_32_;
            auVar90 = vfmadd213ps_avx512vl(auVar117,auVar117,auVar88);
            auVar11 = vfmadd231ps_fma(auVar90,auVar118,auVar118);
            auVar90 = vrsqrt14ps_avx512vl(ZEXT1632(auVar11));
            auVar183._8_4_ = 0xbf000000;
            auVar183._0_8_ = 0xbf000000bf000000;
            auVar183._12_4_ = 0xbf000000;
            auVar183._16_4_ = 0xbf000000;
            auVar183._20_4_ = 0xbf000000;
            auVar183._24_4_ = 0xbf000000;
            auVar183._28_4_ = 0xbf000000;
            fVar161 = auVar90._0_4_;
            fVar133 = auVar90._4_4_;
            fVar147 = auVar90._8_4_;
            fVar148 = auVar90._12_4_;
            fVar149 = auVar90._16_4_;
            fVar165 = auVar90._20_4_;
            fVar166 = auVar90._24_4_;
            auVar53._4_4_ = fVar133 * fVar133 * fVar133 * auVar11._4_4_ * -0.5;
            auVar53._0_4_ = fVar161 * fVar161 * fVar161 * auVar11._0_4_ * -0.5;
            auVar53._8_4_ = fVar147 * fVar147 * fVar147 * auVar11._8_4_ * -0.5;
            auVar53._12_4_ = fVar148 * fVar148 * fVar148 * auVar11._12_4_ * -0.5;
            auVar53._16_4_ = fVar149 * fVar149 * fVar149 * -0.0;
            auVar53._20_4_ = fVar165 * fVar165 * fVar165 * -0.0;
            auVar53._24_4_ = fVar166 * fVar166 * fVar166 * -0.0;
            auVar53._28_4_ = auVar118._28_4_;
            auVar91 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar90 = vfmadd231ps_avx512vl(auVar53,auVar91,auVar90);
            auVar54._4_4_ = auVar118._4_4_ * auVar90._4_4_;
            auVar54._0_4_ = auVar118._0_4_ * auVar90._0_4_;
            auVar54._8_4_ = auVar118._8_4_ * auVar90._8_4_;
            auVar54._12_4_ = auVar118._12_4_ * auVar90._12_4_;
            auVar54._16_4_ = auVar118._16_4_ * auVar90._16_4_;
            auVar54._20_4_ = auVar118._20_4_ * auVar90._20_4_;
            auVar54._24_4_ = auVar118._24_4_ * auVar90._24_4_;
            auVar54._28_4_ = 0;
            auVar55._4_4_ = auVar90._4_4_ * -auVar117._4_4_;
            auVar55._0_4_ = auVar90._0_4_ * -auVar117._0_4_;
            auVar55._8_4_ = auVar90._8_4_ * -auVar117._8_4_;
            auVar55._12_4_ = auVar90._12_4_ * -auVar117._12_4_;
            auVar55._16_4_ = auVar90._16_4_ * -auVar117._16_4_;
            auVar55._20_4_ = auVar90._20_4_ * -auVar117._20_4_;
            auVar55._24_4_ = auVar90._24_4_ * -auVar117._24_4_;
            auVar55._28_4_ = auVar118._28_4_;
            auVar92 = vmulps_avx512vl(auVar90,auVar88);
            auVar90 = vfmadd213ps_avx512vl(auVar119,auVar119,auVar88);
            auVar90 = vfmadd231ps_avx512vl(auVar90,auVar120,auVar120);
            auVar102 = vrsqrt14ps_avx512vl(auVar90);
            auVar90 = vmulps_avx512vl(auVar90,auVar183);
            fVar161 = auVar102._0_4_;
            fVar133 = auVar102._4_4_;
            fVar147 = auVar102._8_4_;
            fVar148 = auVar102._12_4_;
            fVar149 = auVar102._16_4_;
            fVar165 = auVar102._20_4_;
            fVar166 = auVar102._24_4_;
            auVar56._4_4_ = fVar133 * fVar133 * fVar133 * auVar90._4_4_;
            auVar56._0_4_ = fVar161 * fVar161 * fVar161 * auVar90._0_4_;
            auVar56._8_4_ = fVar147 * fVar147 * fVar147 * auVar90._8_4_;
            auVar56._12_4_ = fVar148 * fVar148 * fVar148 * auVar90._12_4_;
            auVar56._16_4_ = fVar149 * fVar149 * fVar149 * auVar90._16_4_;
            auVar56._20_4_ = fVar165 * fVar165 * fVar165 * auVar90._20_4_;
            auVar56._24_4_ = fVar166 * fVar166 * fVar166 * auVar90._24_4_;
            auVar56._28_4_ = auVar90._28_4_;
            auVar90 = vfmadd231ps_avx512vl(auVar56,auVar91,auVar102);
            auVar57._4_4_ = auVar120._4_4_ * auVar90._4_4_;
            auVar57._0_4_ = auVar120._0_4_ * auVar90._0_4_;
            auVar57._8_4_ = auVar120._8_4_ * auVar90._8_4_;
            auVar57._12_4_ = auVar120._12_4_ * auVar90._12_4_;
            auVar57._16_4_ = auVar120._16_4_ * auVar90._16_4_;
            auVar57._20_4_ = auVar120._20_4_ * auVar90._20_4_;
            auVar57._24_4_ = auVar120._24_4_ * auVar90._24_4_;
            auVar57._28_4_ = auVar102._28_4_;
            auVar58._4_4_ = auVar90._4_4_ * auVar93._4_4_;
            auVar58._0_4_ = auVar90._0_4_ * auVar93._0_4_;
            auVar58._8_4_ = auVar90._8_4_ * auVar93._8_4_;
            auVar58._12_4_ = auVar90._12_4_ * auVar93._12_4_;
            auVar58._16_4_ = auVar90._16_4_ * auVar93._16_4_;
            auVar58._20_4_ = auVar90._20_4_ * auVar93._20_4_;
            auVar58._24_4_ = auVar90._24_4_ * auVar93._24_4_;
            auVar58._28_4_ = auVar93._28_4_;
            auVar93 = vmulps_avx512vl(auVar90,auVar88);
            auVar11 = vfmadd213ps_fma(auVar54,ZEXT1632(auVar83),ZEXT1632(auVar84));
            auVar90 = ZEXT1632(auVar83);
            auVar12 = vfmadd213ps_fma(auVar55,auVar90,ZEXT1632(auVar80));
            auVar91 = vfmadd213ps_avx512vl(auVar92,auVar90,auVar94);
            auVar102 = vfmadd213ps_avx512vl(auVar57,ZEXT1632(auVar10),auVar89);
            auVar81 = vfnmadd213ps_fma(auVar54,auVar90,ZEXT1632(auVar84));
            auVar101 = ZEXT1632(auVar10);
            auVar84 = vfmadd213ps_fma(auVar58,auVar101,auVar98);
            auVar86 = vfnmadd213ps_fma(auVar55,auVar90,ZEXT1632(auVar80));
            auVar80 = vfmadd213ps_fma(auVar93,auVar101,auVar95);
            auVar99 = ZEXT1632(auVar83);
            auVar162 = vfnmadd231ps_fma(auVar94,auVar99,auVar92);
            auVar82 = vfnmadd213ps_fma(auVar57,auVar101,auVar89);
            auVar85 = vfnmadd213ps_fma(auVar58,auVar101,auVar98);
            auVar163 = vfnmadd231ps_fma(auVar95,ZEXT1632(auVar10),auVar93);
            auVar95 = vsubps_avx512vl(auVar102,ZEXT1632(auVar81));
            auVar93 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar86));
            auVar90 = vsubps_avx(ZEXT1632(auVar80),ZEXT1632(auVar162));
            auVar59._4_4_ = auVar93._4_4_ * auVar162._4_4_;
            auVar59._0_4_ = auVar93._0_4_ * auVar162._0_4_;
            auVar59._8_4_ = auVar93._8_4_ * auVar162._8_4_;
            auVar59._12_4_ = auVar93._12_4_ * auVar162._12_4_;
            auVar59._16_4_ = auVar93._16_4_ * 0.0;
            auVar59._20_4_ = auVar93._20_4_ * 0.0;
            auVar59._24_4_ = auVar93._24_4_ * 0.0;
            auVar59._28_4_ = auVar92._28_4_;
            auVar83 = vfmsub231ps_fma(auVar59,ZEXT1632(auVar86),auVar90);
            auVar60._4_4_ = auVar90._4_4_ * auVar81._4_4_;
            auVar60._0_4_ = auVar90._0_4_ * auVar81._0_4_;
            auVar60._8_4_ = auVar90._8_4_ * auVar81._8_4_;
            auVar60._12_4_ = auVar90._12_4_ * auVar81._12_4_;
            auVar60._16_4_ = auVar90._16_4_ * 0.0;
            auVar60._20_4_ = auVar90._20_4_ * 0.0;
            auVar60._24_4_ = auVar90._24_4_ * 0.0;
            auVar60._28_4_ = auVar90._28_4_;
            auVar13 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar162),auVar95);
            auVar61._4_4_ = auVar86._4_4_ * auVar95._4_4_;
            auVar61._0_4_ = auVar86._0_4_ * auVar95._0_4_;
            auVar61._8_4_ = auVar86._8_4_ * auVar95._8_4_;
            auVar61._12_4_ = auVar86._12_4_ * auVar95._12_4_;
            auVar61._16_4_ = auVar95._16_4_ * 0.0;
            auVar61._20_4_ = auVar95._20_4_ * 0.0;
            auVar61._24_4_ = auVar95._24_4_ * 0.0;
            auVar61._28_4_ = auVar95._28_4_;
            auVar14 = vfmsub231ps_fma(auVar61,ZEXT1632(auVar81),auVar93);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar14),auVar88,ZEXT1632(auVar13));
            auVar93 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar83));
            uVar73 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar71 = (byte)uVar73;
            fVar168 = (float)((uint)(bVar71 & 1) * auVar11._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * auVar82._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar127 = (float)((uint)bVar19 * auVar11._4_4_ | (uint)!bVar19 * auVar82._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar129 = (float)((uint)bVar19 * auVar11._8_4_ | (uint)!bVar19 * auVar82._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar131 = (float)((uint)bVar19 * auVar11._12_4_ | (uint)!bVar19 * auVar82._12_4_);
            auVar101 = ZEXT1632(CONCAT412(fVar131,CONCAT48(fVar129,CONCAT44(fVar127,fVar168))));
            fVar169 = (float)((uint)(bVar71 & 1) * auVar12._0_4_ |
                             (uint)!(bool)(bVar71 & 1) * auVar85._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            fVar128 = (float)((uint)bVar19 * auVar12._4_4_ | (uint)!bVar19 * auVar85._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            fVar130 = (float)((uint)bVar19 * auVar12._8_4_ | (uint)!bVar19 * auVar85._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            fVar132 = (float)((uint)bVar19 * auVar12._12_4_ | (uint)!bVar19 * auVar85._12_4_);
            auVar96 = ZEXT1632(CONCAT412(fVar132,CONCAT48(fVar130,CONCAT44(fVar128,fVar169))));
            auVar121._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar91._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar163._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar121._4_4_ = (float)((uint)bVar19 * auVar91._4_4_ | (uint)!bVar19 * auVar163._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar121._8_4_ = (float)((uint)bVar19 * auVar91._8_4_ | (uint)!bVar19 * auVar163._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar121._12_4_ =
                 (float)((uint)bVar19 * auVar91._12_4_ | (uint)!bVar19 * auVar163._12_4_);
            fVar147 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar91._16_4_);
            auVar121._16_4_ = fVar147;
            fVar133 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar91._20_4_);
            auVar121._20_4_ = fVar133;
            fVar161 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar91._24_4_);
            auVar121._24_4_ = fVar161;
            iVar1 = (uint)(byte)(uVar73 >> 7) * auVar91._28_4_;
            auVar121._28_4_ = iVar1;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar81),auVar102);
            auVar122._0_4_ =
                 (uint)(bVar71 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar71 & 1) * auVar83._0_4_;
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar122._4_4_ = (uint)bVar19 * auVar93._4_4_ | (uint)!bVar19 * auVar83._4_4_;
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar122._8_4_ = (uint)bVar19 * auVar93._8_4_ | (uint)!bVar19 * auVar83._8_4_;
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar122._12_4_ = (uint)bVar19 * auVar93._12_4_ | (uint)!bVar19 * auVar83._12_4_;
            auVar122._16_4_ = (uint)((byte)(uVar73 >> 4) & 1) * auVar93._16_4_;
            auVar122._20_4_ = (uint)((byte)(uVar73 >> 5) & 1) * auVar93._20_4_;
            auVar122._24_4_ = (uint)((byte)(uVar73 >> 6) & 1) * auVar93._24_4_;
            auVar122._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar86),ZEXT1632(auVar84));
            auVar123._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar11._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar123._4_4_ = (float)((uint)bVar19 * auVar93._4_4_ | (uint)!bVar19 * auVar11._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar123._8_4_ = (float)((uint)bVar19 * auVar93._8_4_ | (uint)!bVar19 * auVar11._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar123._12_4_ =
                 (float)((uint)bVar19 * auVar93._12_4_ | (uint)!bVar19 * auVar11._12_4_);
            fVar149 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar93._16_4_);
            auVar123._16_4_ = fVar149;
            fVar165 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar93._20_4_);
            auVar123._20_4_ = fVar165;
            fVar148 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar93._24_4_);
            auVar123._24_4_ = fVar148;
            auVar123._28_4_ = (uint)(byte)(uVar73 >> 7) * auVar93._28_4_;
            auVar93 = vblendmps_avx512vl(ZEXT1632(auVar162),ZEXT1632(auVar80));
            auVar124._0_4_ =
                 (float)((uint)(bVar71 & 1) * auVar93._0_4_ |
                        (uint)!(bool)(bVar71 & 1) * auVar12._0_4_);
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar124._4_4_ = (float)((uint)bVar19 * auVar93._4_4_ | (uint)!bVar19 * auVar12._4_4_);
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar124._8_4_ = (float)((uint)bVar19 * auVar93._8_4_ | (uint)!bVar19 * auVar12._8_4_);
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar124._12_4_ =
                 (float)((uint)bVar19 * auVar93._12_4_ | (uint)!bVar19 * auVar12._12_4_);
            fVar166 = (float)((uint)((byte)(uVar73 >> 4) & 1) * auVar93._16_4_);
            auVar124._16_4_ = fVar166;
            fVar167 = (float)((uint)((byte)(uVar73 >> 5) & 1) * auVar93._20_4_);
            auVar124._20_4_ = fVar167;
            fVar150 = (float)((uint)((byte)(uVar73 >> 6) & 1) * auVar93._24_4_);
            auVar124._24_4_ = fVar150;
            iVar2 = (uint)(byte)(uVar73 >> 7) * auVar93._28_4_;
            auVar124._28_4_ = iVar2;
            auVar125._0_4_ =
                 (uint)(bVar71 & 1) * (int)auVar81._0_4_ |
                 (uint)!(bool)(bVar71 & 1) * auVar102._0_4_;
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar125._4_4_ = (uint)bVar19 * (int)auVar81._4_4_ | (uint)!bVar19 * auVar102._4_4_;
            bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar125._8_4_ = (uint)bVar19 * (int)auVar81._8_4_ | (uint)!bVar19 * auVar102._8_4_;
            bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar125._12_4_ = (uint)bVar19 * (int)auVar81._12_4_ | (uint)!bVar19 * auVar102._12_4_;
            auVar125._16_4_ = (uint)!(bool)((byte)(uVar73 >> 4) & 1) * auVar102._16_4_;
            auVar125._20_4_ = (uint)!(bool)((byte)(uVar73 >> 5) & 1) * auVar102._20_4_;
            auVar125._24_4_ = (uint)!(bool)((byte)(uVar73 >> 6) & 1) * auVar102._24_4_;
            auVar125._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar102._28_4_;
            bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar21 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar23 = (bool)((byte)(uVar73 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar73 >> 1) & 1);
            bVar22 = (bool)((byte)(uVar73 >> 2) & 1);
            bVar24 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar102 = vsubps_avx512vl(auVar125,auVar101);
            auVar90 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar23 * (int)auVar86._12_4_ |
                                                    (uint)!bVar23 * auVar84._12_4_,
                                                    CONCAT48((uint)bVar21 * (int)auVar86._8_4_ |
                                                             (uint)!bVar21 * auVar84._8_4_,
                                                             CONCAT44((uint)bVar19 *
                                                                      (int)auVar86._4_4_ |
                                                                      (uint)!bVar19 * auVar84._4_4_,
                                                                      (uint)(bVar71 & 1) *
                                                                      (int)auVar86._0_4_ |
                                                                      (uint)!(bool)(bVar71 & 1) *
                                                                      auVar84._0_4_)))),auVar96);
            auVar91 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar24 * (int)auVar162._12_4_ |
                                                    (uint)!bVar24 * auVar80._12_4_,
                                                    CONCAT48((uint)bVar22 * (int)auVar162._8_4_ |
                                                             (uint)!bVar22 * auVar80._8_4_,
                                                             CONCAT44((uint)bVar20 *
                                                                      (int)auVar162._4_4_ |
                                                                      (uint)!bVar20 * auVar80._4_4_,
                                                                      (uint)(bVar71 & 1) *
                                                                      (int)auVar162._0_4_ |
                                                                      (uint)!(bool)(bVar71 & 1) *
                                                                      auVar80._0_4_)))),auVar121);
            auVar92 = vsubps_avx(auVar101,auVar122);
            auVar95 = vsubps_avx(auVar96,auVar123);
            auVar94 = vsubps_avx(auVar121,auVar124);
            auVar62._4_4_ = auVar91._4_4_ * fVar127;
            auVar62._0_4_ = auVar91._0_4_ * fVar168;
            auVar62._8_4_ = auVar91._8_4_ * fVar129;
            auVar62._12_4_ = auVar91._12_4_ * fVar131;
            auVar62._16_4_ = auVar91._16_4_ * 0.0;
            auVar62._20_4_ = auVar91._20_4_ * 0.0;
            auVar62._24_4_ = auVar91._24_4_ * 0.0;
            auVar62._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar62,auVar121,auVar102);
            auVar154._0_4_ = fVar169 * auVar102._0_4_;
            auVar154._4_4_ = fVar128 * auVar102._4_4_;
            auVar154._8_4_ = fVar130 * auVar102._8_4_;
            auVar154._12_4_ = fVar132 * auVar102._12_4_;
            auVar154._16_4_ = auVar102._16_4_ * 0.0;
            auVar154._20_4_ = auVar102._20_4_ * 0.0;
            auVar154._24_4_ = auVar102._24_4_ * 0.0;
            auVar154._28_4_ = 0;
            auVar84 = vfmsub231ps_fma(auVar154,auVar101,auVar90);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar88,ZEXT1632(auVar83));
            auVar157._0_4_ = auVar90._0_4_ * auVar121._0_4_;
            auVar157._4_4_ = auVar90._4_4_ * auVar121._4_4_;
            auVar157._8_4_ = auVar90._8_4_ * auVar121._8_4_;
            auVar157._12_4_ = auVar90._12_4_ * auVar121._12_4_;
            auVar157._16_4_ = auVar90._16_4_ * fVar147;
            auVar157._20_4_ = auVar90._20_4_ * fVar133;
            auVar157._24_4_ = auVar90._24_4_ * fVar161;
            auVar157._28_4_ = 0;
            auVar83 = vfmsub231ps_fma(auVar157,auVar96,auVar91);
            auVar97 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar83));
            auVar93 = vmulps_avx512vl(auVar94,auVar122);
            auVar93 = vfmsub231ps_avx512vl(auVar93,auVar92,auVar124);
            auVar63._4_4_ = auVar95._4_4_ * auVar124._4_4_;
            auVar63._0_4_ = auVar95._0_4_ * auVar124._0_4_;
            auVar63._8_4_ = auVar95._8_4_ * auVar124._8_4_;
            auVar63._12_4_ = auVar95._12_4_ * auVar124._12_4_;
            auVar63._16_4_ = auVar95._16_4_ * fVar166;
            auVar63._20_4_ = auVar95._20_4_ * fVar167;
            auVar63._24_4_ = auVar95._24_4_ * fVar150;
            auVar63._28_4_ = iVar2;
            auVar83 = vfmsub231ps_fma(auVar63,auVar123,auVar94);
            auVar158._0_4_ = auVar123._0_4_ * auVar92._0_4_;
            auVar158._4_4_ = auVar123._4_4_ * auVar92._4_4_;
            auVar158._8_4_ = auVar123._8_4_ * auVar92._8_4_;
            auVar158._12_4_ = auVar123._12_4_ * auVar92._12_4_;
            auVar158._16_4_ = fVar149 * auVar92._16_4_;
            auVar158._20_4_ = fVar165 * auVar92._20_4_;
            auVar158._24_4_ = fVar148 * auVar92._24_4_;
            auVar158._28_4_ = 0;
            auVar84 = vfmsub231ps_fma(auVar158,auVar95,auVar122);
            auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar84),auVar88,auVar93);
            auVar89 = vfmadd231ps_avx512vl(auVar93,auVar88,ZEXT1632(auVar83));
            auVar93 = vmaxps_avx(auVar97,auVar89);
            uVar141 = vcmpps_avx512vl(auVar93,auVar88,2);
            bVar79 = bVar79 & (byte)uVar141;
            if (bVar79 != 0) {
              auVar64._4_4_ = auVar94._4_4_ * auVar90._4_4_;
              auVar64._0_4_ = auVar94._0_4_ * auVar90._0_4_;
              auVar64._8_4_ = auVar94._8_4_ * auVar90._8_4_;
              auVar64._12_4_ = auVar94._12_4_ * auVar90._12_4_;
              auVar64._16_4_ = auVar94._16_4_ * auVar90._16_4_;
              auVar64._20_4_ = auVar94._20_4_ * auVar90._20_4_;
              auVar64._24_4_ = auVar94._24_4_ * auVar90._24_4_;
              auVar64._28_4_ = auVar93._28_4_;
              auVar80 = vfmsub231ps_fma(auVar64,auVar95,auVar91);
              auVar65._4_4_ = auVar91._4_4_ * auVar92._4_4_;
              auVar65._0_4_ = auVar91._0_4_ * auVar92._0_4_;
              auVar65._8_4_ = auVar91._8_4_ * auVar92._8_4_;
              auVar65._12_4_ = auVar91._12_4_ * auVar92._12_4_;
              auVar65._16_4_ = auVar91._16_4_ * auVar92._16_4_;
              auVar65._20_4_ = auVar91._20_4_ * auVar92._20_4_;
              auVar65._24_4_ = auVar91._24_4_ * auVar92._24_4_;
              auVar65._28_4_ = auVar91._28_4_;
              auVar84 = vfmsub231ps_fma(auVar65,auVar102,auVar94);
              auVar66._4_4_ = auVar95._4_4_ * auVar102._4_4_;
              auVar66._0_4_ = auVar95._0_4_ * auVar102._0_4_;
              auVar66._8_4_ = auVar95._8_4_ * auVar102._8_4_;
              auVar66._12_4_ = auVar95._12_4_ * auVar102._12_4_;
              auVar66._16_4_ = auVar95._16_4_ * auVar102._16_4_;
              auVar66._20_4_ = auVar95._20_4_ * auVar102._20_4_;
              auVar66._24_4_ = auVar95._24_4_ * auVar102._24_4_;
              auVar66._28_4_ = auVar95._28_4_;
              auVar11 = vfmsub231ps_fma(auVar66,auVar92,auVar90);
              auVar83 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar84),ZEXT1632(auVar11));
              auVar93 = vfmadd231ps_avx512vl(ZEXT1632(auVar83),ZEXT1632(auVar80),auVar88);
              auVar90 = vrcp14ps_avx512vl(auVar93);
              auVar92 = auVar186._0_32_;
              auVar91 = vfnmadd213ps_avx512vl(auVar90,auVar93,auVar92);
              auVar83 = vfmadd132ps_fma(auVar91,auVar90,auVar90);
              auVar67._4_4_ = auVar11._4_4_ * auVar121._4_4_;
              auVar67._0_4_ = auVar11._0_4_ * auVar121._0_4_;
              auVar67._8_4_ = auVar11._8_4_ * auVar121._8_4_;
              auVar67._12_4_ = auVar11._12_4_ * auVar121._12_4_;
              auVar67._16_4_ = fVar147 * 0.0;
              auVar67._20_4_ = fVar133 * 0.0;
              auVar67._24_4_ = fVar161 * 0.0;
              auVar67._28_4_ = iVar1;
              auVar84 = vfmadd231ps_fma(auVar67,auVar96,ZEXT1632(auVar84));
              auVar84 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar101,ZEXT1632(auVar80));
              fVar133 = auVar83._0_4_;
              fVar147 = auVar83._4_4_;
              fVar148 = auVar83._8_4_;
              fVar149 = auVar83._12_4_;
              local_220 = ZEXT1632(CONCAT412(auVar84._12_4_ * fVar149,
                                             CONCAT48(auVar84._8_4_ * fVar148,
                                                      CONCAT44(auVar84._4_4_ * fVar147,
                                                               auVar84._0_4_ * fVar133))));
              uVar141 = vcmpps_avx512vl(local_220,local_2e0,0xd);
              fVar161 = local_540->tfar;
              auVar31._4_4_ = fVar161;
              auVar31._0_4_ = fVar161;
              auVar31._8_4_ = fVar161;
              auVar31._12_4_ = fVar161;
              auVar31._16_4_ = fVar161;
              auVar31._20_4_ = fVar161;
              auVar31._24_4_ = fVar161;
              auVar31._28_4_ = fVar161;
              uVar25 = vcmpps_avx512vl(local_220,auVar31,2);
              bVar79 = (byte)uVar141 & (byte)uVar25 & bVar79;
              if (bVar79 != 0) {
                uVar141 = vcmpps_avx512vl(auVar93,auVar88,4);
                bVar79 = bVar79 & (byte)uVar141;
                auVar180 = ZEXT3264(local_360);
                auVar184 = ZEXT3264(local_380);
                if (bVar79 != 0) {
                  fVar161 = auVar97._0_4_ * fVar133;
                  fVar165 = auVar97._4_4_ * fVar147;
                  auVar68._4_4_ = fVar165;
                  auVar68._0_4_ = fVar161;
                  fVar166 = auVar97._8_4_ * fVar148;
                  auVar68._8_4_ = fVar166;
                  fVar167 = auVar97._12_4_ * fVar149;
                  auVar68._12_4_ = fVar167;
                  fVar150 = auVar97._16_4_ * 0.0;
                  auVar68._16_4_ = fVar150;
                  fVar168 = auVar97._20_4_ * 0.0;
                  auVar68._20_4_ = fVar168;
                  fVar169 = auVar97._24_4_ * 0.0;
                  auVar68._24_4_ = fVar169;
                  auVar68._28_4_ = auVar93._28_4_;
                  auVar90 = vsubps_avx512vl(auVar92,auVar68);
                  local_260._0_4_ =
                       (float)((uint)(bVar71 & 1) * (int)fVar161 |
                              (uint)!(bool)(bVar71 & 1) * auVar90._0_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
                  local_260._4_4_ =
                       (float)((uint)bVar19 * (int)fVar165 | (uint)!bVar19 * auVar90._4_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
                  local_260._8_4_ =
                       (float)((uint)bVar19 * (int)fVar166 | (uint)!bVar19 * auVar90._8_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
                  local_260._12_4_ =
                       (float)((uint)bVar19 * (int)fVar167 | (uint)!bVar19 * auVar90._12_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
                  local_260._16_4_ =
                       (float)((uint)bVar19 * (int)fVar150 | (uint)!bVar19 * auVar90._16_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
                  local_260._20_4_ =
                       (float)((uint)bVar19 * (int)fVar168 | (uint)!bVar19 * auVar90._20_4_);
                  bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
                  local_260._24_4_ =
                       (float)((uint)bVar19 * (int)fVar169 | (uint)!bVar19 * auVar90._24_4_);
                  bVar19 = SUB81(uVar73 >> 7,0);
                  local_260._28_4_ =
                       (float)((uint)bVar19 * auVar93._28_4_ | (uint)!bVar19 * auVar90._28_4_);
                  auVar93 = vsubps_avx(ZEXT1632(auVar10),auVar99);
                  auVar83 = vfmadd213ps_fma(auVar93,local_260,auVar99);
                  fVar161 = local_528->depth_scale;
                  auVar32._4_4_ = fVar161;
                  auVar32._0_4_ = fVar161;
                  auVar32._8_4_ = fVar161;
                  auVar32._12_4_ = fVar161;
                  auVar32._16_4_ = fVar161;
                  auVar32._20_4_ = fVar161;
                  auVar32._24_4_ = fVar161;
                  auVar32._28_4_ = fVar161;
                  auVar93 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar83._12_4_ + auVar83._12_4_,
                                                               CONCAT48(auVar83._8_4_ +
                                                                        auVar83._8_4_,
                                                                        CONCAT44(auVar83._4_4_ +
                                                                                 auVar83._4_4_,
                                                                                 auVar83._0_4_ +
                                                                                 auVar83._0_4_)))),
                                            auVar32);
                  uVar141 = vcmpps_avx512vl(local_220,auVar93,6);
                  if (((byte)uVar141 & bVar79) != 0) {
                    auVar9._0_4_ = local_540->tfar;
                    auVar9._4_4_ = local_540->mask;
                    auVar9._8_4_ = local_540->id;
                    auVar9._12_4_ = local_540->flags;
                    uVar72 = vextractps_avx(auVar9,1);
                    auVar140._0_4_ = auVar89._0_4_ * fVar133;
                    auVar140._4_4_ = auVar89._4_4_ * fVar147;
                    auVar140._8_4_ = auVar89._8_4_ * fVar148;
                    auVar140._12_4_ = auVar89._12_4_ * fVar149;
                    auVar140._16_4_ = auVar89._16_4_ * 0.0;
                    auVar140._20_4_ = auVar89._20_4_ * 0.0;
                    auVar140._24_4_ = auVar89._24_4_ * 0.0;
                    auVar140._28_4_ = 0;
                    auVar93 = vsubps_avx512vl(auVar92,auVar140);
                    auVar126._0_4_ =
                         (uint)(bVar71 & 1) * (int)auVar140._0_4_ |
                         (uint)!(bool)(bVar71 & 1) * auVar93._0_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 1) & 1);
                    auVar126._4_4_ =
                         (uint)bVar19 * (int)auVar140._4_4_ | (uint)!bVar19 * auVar93._4_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 2) & 1);
                    auVar126._8_4_ =
                         (uint)bVar19 * (int)auVar140._8_4_ | (uint)!bVar19 * auVar93._8_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 3) & 1);
                    auVar126._12_4_ =
                         (uint)bVar19 * (int)auVar140._12_4_ | (uint)!bVar19 * auVar93._12_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 4) & 1);
                    auVar126._16_4_ =
                         (uint)bVar19 * (int)auVar140._16_4_ | (uint)!bVar19 * auVar93._16_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 5) & 1);
                    auVar126._20_4_ =
                         (uint)bVar19 * (int)auVar140._20_4_ | (uint)!bVar19 * auVar93._20_4_;
                    bVar19 = (bool)((byte)(uVar73 >> 6) & 1);
                    auVar126._24_4_ =
                         (uint)bVar19 * (int)auVar140._24_4_ | (uint)!bVar19 * auVar93._24_4_;
                    auVar126._28_4_ = (uint)!SUB81(uVar73 >> 7,0) * auVar93._28_4_;
                    auVar33._8_4_ = 0x40000000;
                    auVar33._0_8_ = 0x4000000040000000;
                    auVar33._12_4_ = 0x40000000;
                    auVar33._16_4_ = 0x40000000;
                    auVar33._20_4_ = 0x40000000;
                    auVar33._24_4_ = 0x40000000;
                    auVar33._28_4_ = 0x40000000;
                    local_240 = vfmsub132ps_avx512vl(auVar126,auVar92,auVar33);
                    local_200 = (int)lVar75;
                    local_1fc = iVar16;
                    local_1f0 = local_470;
                    local_1e0 = local_480;
                    local_1d0 = local_520;
                    uStack_1c8 = uStack_518;
                    pGVar17 = (context->scene->geometries).items[local_530].ptr;
                    if ((pGVar17->mask & uVar72) == 0) {
                      bVar71 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar71 = 1, pGVar17->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar83 = vcvtsi2ss_avx512f(auVar87._0_16_,(int)lVar75);
                      fVar161 = auVar83._0_4_;
                      local_1a0[0] = (fVar161 + local_260._0_4_ + 0.0) * (float)local_300._0_4_;
                      local_1a0[1] = (fVar161 + local_260._4_4_ + 1.0) * (float)local_300._4_4_;
                      local_1a0[2] = (fVar161 + local_260._8_4_ + 2.0) * fStack_2f8;
                      local_1a0[3] = (fVar161 + local_260._12_4_ + 3.0) * fStack_2f4;
                      fStack_190 = (fVar161 + local_260._16_4_ + 4.0) * fStack_2f0;
                      fStack_18c = (fVar161 + local_260._20_4_ + 5.0) * fStack_2ec;
                      fStack_188 = (fVar161 + local_260._24_4_ + 6.0) * fStack_2e8;
                      fStack_184 = fVar161 + local_260._28_4_ + 7.0;
                      local_180 = local_240;
                      local_160 = local_220;
                      uVar73 = CONCAT71(0,(byte)uVar141 & bVar79);
                      local_4e0._0_8_ = uVar73;
                      lVar74 = 0;
                      for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                        lVar74 = lVar74 + 1;
                      }
                      local_490 = context;
                      local_270 = auVar9;
                      local_498 = pGVar17;
                      do {
                        auVar80 = auVar185._0_16_;
                        local_4c4 = local_1a0[lVar74];
                        local_4c0 = *(undefined4 *)(local_180 + lVar74 * 4);
                        local_460._0_8_ = lVar74;
                        local_540->tfar = *(float *)(local_160 + lVar74 * 4);
                        local_510.context = local_490->user;
                        fVar133 = 1.0 - local_4c4;
                        fVar161 = fVar133 * fVar133 * -3.0;
                        auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar133 * fVar133)),
                                                  ZEXT416((uint)(local_4c4 * fVar133)),
                                                  ZEXT416(0xc0000000));
                        auVar84 = vfmsub132ss_fma(ZEXT416((uint)(local_4c4 * fVar133)),
                                                  ZEXT416((uint)(local_4c4 * local_4c4)),
                                                  ZEXT416(0x40000000));
                        fVar133 = auVar83._0_4_ * 3.0;
                        fVar147 = auVar84._0_4_ * 3.0;
                        fVar148 = local_4c4 * local_4c4 * 3.0;
                        auVar160._0_4_ = fVar148 * local_450;
                        auVar160._4_4_ = fVar148 * fStack_44c;
                        auVar160._8_4_ = fVar148 * fStack_448;
                        auVar160._12_4_ = fVar148 * fStack_444;
                        auVar144._4_4_ = fVar147;
                        auVar144._0_4_ = fVar147;
                        auVar144._8_4_ = fVar147;
                        auVar144._12_4_ = fVar147;
                        auVar70._8_8_ = uStack_518;
                        auVar70._0_8_ = local_520;
                        auVar83 = vfmadd132ps_fma(auVar144,auVar160,auVar70);
                        auVar152._4_4_ = fVar133;
                        auVar152._0_4_ = fVar133;
                        auVar152._8_4_ = fVar133;
                        auVar152._12_4_ = fVar133;
                        auVar83 = vfmadd213ps_fma(auVar152,local_480,auVar83);
                        auVar145._4_4_ = fVar161;
                        auVar145._0_4_ = fVar161;
                        auVar145._8_4_ = fVar161;
                        auVar145._12_4_ = fVar161;
                        auVar83 = vfmadd213ps_fma(auVar145,local_470,auVar83);
                        local_4d0 = vmovlps_avx(auVar83);
                        local_4c8 = vextractps_avx(auVar83,2);
                        local_4bc = (int)local_488;
                        local_4b8 = (int)local_530;
                        local_4b4 = (local_510.context)->instID[0];
                        local_4b0 = (local_510.context)->instPrimID[0];
                        local_544 = -1;
                        local_510.valid = &local_544;
                        local_510.geometryUserPtr = local_498->userPtr;
                        local_510.ray = (RTCRayN *)local_540;
                        local_510.hit = (RTCHitN *)&local_4d0;
                        local_510.N = 1;
                        if ((local_498->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*local_498->occlusionFilterN)(&local_510), *local_510.valid != 0)) {
                          p_Var18 = local_490->args->filter;
                          if ((p_Var18 == (RTCFilterFunctionN)0x0) ||
                             ((((local_490->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                == RTC_RAY_QUERY_FLAG_INCOHERENT &&
                               (((local_498->field_8).field_0x2 & 0x40) == 0)) ||
                              ((*p_Var18)(&local_510), *local_510.valid != 0)))) {
                            bVar71 = 1;
                            auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                            auVar186 = ZEXT3264(auVar93);
                            auVar83 = vxorps_avx512vl(auVar80,auVar80);
                            auVar185 = ZEXT1664(auVar83);
                            auVar180 = ZEXT3264(local_360);
                            auVar184 = ZEXT3264(local_380);
                            auVar189 = ZEXT3264(local_3e0);
                            auVar191 = ZEXT3264(local_3a0);
                            auVar187 = ZEXT3264(local_400);
                            auVar190 = ZEXT3264(local_420);
                            auVar188 = ZEXT3264(local_3c0);
                            auVar192 = ZEXT3264(local_440);
                            context = local_490;
                            break;
                          }
                        }
                        local_540->tfar = (float)local_270._0_4_;
                        uVar76 = local_4e0._0_8_ ^ 1L << (local_460._0_8_ & 0x3f);
                        bVar71 = 0;
                        local_4e0._0_8_ = uVar76;
                        lVar74 = 0;
                        for (uVar73 = uVar76; (uVar73 & 1) == 0;
                            uVar73 = uVar73 >> 1 | 0x8000000000000000) {
                          lVar74 = lVar74 + 1;
                        }
                        auVar93 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar186 = ZEXT3264(auVar93);
                        auVar83 = vxorps_avx512vl(auVar80,auVar80);
                        auVar185 = ZEXT1664(auVar83);
                        auVar180 = ZEXT3264(local_360);
                        auVar184 = ZEXT3264(local_380);
                        auVar189 = ZEXT3264(local_3e0);
                        auVar191 = ZEXT3264(local_3a0);
                        auVar187 = ZEXT3264(local_400);
                        auVar190 = ZEXT3264(local_420);
                        auVar188 = ZEXT3264(local_3c0);
                        auVar192 = ZEXT3264(local_440);
                        context = local_490;
                      } while (uVar76 != 0);
                    }
                    bVar77 = (bool)(bVar77 | bVar71);
                  }
                }
                goto LAB_01d593dd;
              }
            }
            auVar180 = ZEXT3264(local_360);
            auVar184 = ZEXT3264(local_380);
          }
LAB_01d593dd:
          lVar75 = lVar75 + 8;
        } while ((int)lVar75 < iVar16);
      }
      if (bVar77) {
        return bVar77;
      }
      fVar161 = local_540->tfar;
      auVar30._4_4_ = fVar161;
      auVar30._0_4_ = fVar161;
      auVar30._8_4_ = fVar161;
      auVar30._12_4_ = fVar161;
      auVar30._16_4_ = fVar161;
      auVar30._20_4_ = fVar161;
      auVar30._24_4_ = fVar161;
      auVar30._28_4_ = fVar161;
      uVar141 = vcmpps_avx512vl(local_80,auVar30,2);
      uVar72 = (uint)uVar78 & (uint)uVar141;
      uVar78 = (ulong)uVar72;
    } while (uVar72 != 0);
  }
  return bVar77;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }